

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# getarg_tests.cpp
# Opt level: O1

void __thiscall getarg_tests::setting_args::test_method(setting_args *this)

{
  pointer pcVar1;
  shared_count *psVar2;
  pointer pcVar3;
  undefined1 uVar4;
  undefined7 uVar5;
  bool bVar6;
  int iVar7;
  iterator in_R8;
  iterator pvVar8;
  iterator in_R9;
  iterator pvVar9;
  long in_FS_OFFSET;
  initializer_list<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>
  __l;
  const_string file;
  const_string file_00;
  const_string file_01;
  const_string file_02;
  const_string file_03;
  const_string file_04;
  const_string file_05;
  const_string file_06;
  const_string file_07;
  const_string file_08;
  const_string file_09;
  const_string file_10;
  const_string file_11;
  const_string file_12;
  const_string file_13;
  const_string file_14;
  const_string file_15;
  const_string file_16;
  const_string file_17;
  const_string file_18;
  const_string file_19;
  const_string file_20;
  const_string file_21;
  const_string file_22;
  const_string file_23;
  const_string file_24;
  const_string file_25;
  const_string file_26;
  const_string file_27;
  const_string file_28;
  const_string file_29;
  const_string file_30;
  const_string file_31;
  const_string file_32;
  const_string file_33;
  const_string file_34;
  const_string file_35;
  const_string file_36;
  const_string file_37;
  const_string file_38;
  const_string file_39;
  const_string file_40;
  const_string file_41;
  const_string file_42;
  const_string file_43;
  const_string file_44;
  const_string file_45;
  const_string file_46;
  const_string file_47;
  const_string file_48;
  const_string file_49;
  const_string file_50;
  const_string file_51;
  const_string file_52;
  const_string file_53;
  const_string file_54;
  const_string file_55;
  const_string file_56;
  const_string file_57;
  const_string file_58;
  const_string file_59;
  const_string file_60;
  const_string file_61;
  const_string file_62;
  const_string file_63;
  const_string file_64;
  const_string file_65;
  const_string file_66;
  const_string file_67;
  const_string file_68;
  const_string file_69;
  const_string file_70;
  const_string file_71;
  const_string file_72;
  const_string file_73;
  const_string file_74;
  const_string file_75;
  const_string file_76;
  const_string file_77;
  const_string file_78;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  const_string msg_04;
  const_string msg_05;
  const_string msg_06;
  const_string msg_07;
  const_string msg_08;
  const_string msg_09;
  const_string msg_10;
  const_string msg_11;
  const_string msg_12;
  const_string msg_13;
  const_string msg_14;
  const_string msg_15;
  const_string msg_16;
  const_string msg_17;
  const_string msg_18;
  const_string msg_19;
  const_string msg_20;
  const_string msg_21;
  const_string msg_22;
  const_string msg_23;
  const_string msg_24;
  const_string msg_25;
  const_string msg_26;
  const_string msg_27;
  const_string msg_28;
  const_string msg_29;
  const_string msg_30;
  const_string msg_31;
  const_string msg_32;
  const_string msg_33;
  const_string msg_34;
  const_string msg_35;
  const_string msg_36;
  const_string msg_37;
  const_string msg_38;
  const_string msg_39;
  const_string msg_40;
  const_string msg_41;
  const_string msg_42;
  const_string msg_43;
  const_string msg_44;
  const_string msg_45;
  const_string msg_46;
  const_string msg_47;
  const_string msg_48;
  const_string msg_49;
  const_string msg_50;
  const_string msg_51;
  const_string msg_52;
  const_string msg_53;
  const_string msg_54;
  const_string msg_55;
  const_string msg_56;
  const_string msg_57;
  const_string msg_58;
  const_string msg_59;
  const_string msg_60;
  const_string msg_61;
  const_string msg_62;
  const_string msg_63;
  const_string msg_64;
  const_string msg_65;
  const_string msg_66;
  const_string msg_67;
  const_string msg_68;
  const_string msg_69;
  const_string msg_70;
  const_string msg_71;
  const_string msg_72;
  const_string msg_73;
  const_string msg_74;
  const_string msg_75;
  const_string msg_76;
  const_string msg_77;
  const_string msg_78;
  check_type cVar10;
  undefined1 *local_1218;
  undefined1 *local_1210;
  char *local_1208;
  char *local_1200;
  undefined1 *local_11f8;
  undefined1 *local_11f0;
  char *local_11e8;
  char *local_11e0;
  undefined1 *local_11d8;
  undefined1 *local_11d0;
  char *local_11c8;
  char *local_11c0;
  undefined1 *local_11b8;
  undefined1 *local_11b0;
  char *local_11a8;
  char *local_11a0;
  undefined1 *local_1198;
  undefined1 *local_1190;
  char *local_1188;
  char *local_1180;
  char *local_1148;
  char *local_1140;
  undefined1 *local_1138;
  undefined1 *local_1130;
  char *local_1128;
  char *local_1120;
  undefined1 *local_1118;
  undefined1 *local_1110;
  char *local_1108;
  char *local_1100;
  char *local_10c8;
  char *local_10c0;
  undefined1 *local_10b8;
  undefined1 *local_10b0;
  char *local_10a8;
  char *local_10a0;
  undefined1 *local_1098;
  undefined1 *local_1090;
  char *local_1088;
  char *local_1080;
  char *local_1048;
  char *local_1040;
  undefined1 *local_1038;
  undefined1 *local_1030;
  char *local_1028;
  char *local_1020;
  undefined1 *local_1018;
  undefined1 *local_1010;
  char *local_1008;
  char *local_1000;
  char *local_fc8;
  char *local_fc0;
  undefined1 *local_fb8;
  undefined1 *local_fb0;
  char *local_fa8;
  char *local_fa0;
  undefined1 *local_f98;
  undefined1 *local_f90;
  char *local_f88;
  char *local_f80;
  undefined1 *local_f78;
  undefined1 *local_f70;
  char *local_f68;
  char *local_f60;
  char *local_f28;
  char *local_f20;
  undefined1 *local_f18;
  undefined1 *local_f10;
  char *local_f08;
  char *local_f00;
  undefined1 *local_ef8;
  undefined1 *local_ef0;
  char *local_ee8;
  char *local_ee0;
  char *local_ea8;
  char *local_ea0;
  undefined1 *local_e98;
  undefined1 *local_e90;
  char *local_e88;
  char *local_e80;
  undefined1 *local_e78;
  undefined1 *local_e70;
  char *local_e68;
  char *local_e60;
  char *local_e28;
  char *local_e20;
  undefined1 *local_e18;
  undefined1 *local_e10;
  char *local_e08;
  char *local_e00;
  undefined1 *local_df8;
  undefined1 *local_df0;
  char *local_de8;
  char *local_de0;
  char *local_da8;
  char *local_da0;
  undefined1 *local_d98;
  undefined1 *local_d90;
  char *local_d88;
  char *local_d80;
  undefined1 *local_d78;
  undefined1 *local_d70;
  char *local_d68;
  char *local_d60;
  undefined1 *local_d58;
  undefined1 *local_d50;
  char *local_d48;
  char *local_d40;
  undefined1 *local_d38;
  undefined1 *local_d30;
  char *local_d28;
  char *local_d20;
  undefined1 *local_d18;
  undefined1 *local_d10;
  char *local_d08;
  char *local_d00;
  undefined1 *local_cf8;
  undefined1 *local_cf0;
  char *local_ce8;
  char *local_ce0;
  undefined1 *local_cd8;
  undefined1 *local_cd0;
  char *local_cc8;
  char *local_cc0;
  undefined1 *local_cb8;
  undefined1 *local_cb0;
  char *local_ca8;
  char *local_ca0;
  undefined1 *local_c98;
  undefined1 *local_c90;
  char *local_c88;
  char *local_c80;
  undefined1 *local_c78;
  undefined1 *local_c70;
  char *local_c68;
  char *local_c60;
  undefined1 *local_c58;
  undefined1 *local_c50;
  char *local_c48;
  char *local_c40;
  undefined1 *local_c38;
  undefined1 *local_c30;
  char *local_c28;
  char *local_c20;
  undefined1 *local_c18;
  undefined1 *local_c10;
  char *local_c08;
  char *local_c00;
  char *local_bc8;
  char *local_bc0;
  undefined1 *local_bb8;
  undefined1 *local_bb0;
  char *local_ba8;
  char *local_ba0;
  undefined1 *local_b98;
  undefined1 *local_b90;
  char *local_b88;
  char *local_b80;
  char *local_b48;
  char *local_b40;
  undefined1 *local_b38;
  undefined1 *local_b30;
  char *local_b28;
  char *local_b20;
  undefined1 *local_b18;
  undefined1 *local_b10;
  char *local_b08;
  char *local_b00;
  undefined1 *local_af8;
  undefined1 *local_af0;
  char *local_ae8;
  char *local_ae0;
  undefined1 *local_ad8;
  undefined1 *local_ad0;
  char *local_ac8;
  char *local_ac0;
  undefined1 *local_ab8;
  undefined1 *local_ab0;
  char *local_aa8;
  char *local_aa0;
  char *local_a68;
  char *local_a60;
  undefined1 *local_a58;
  undefined1 *local_a50;
  char *local_a48;
  char *local_a40;
  undefined1 *local_a38;
  undefined1 *local_a30;
  char *local_a28;
  char *local_a20;
  char *local_9e8;
  char *local_9e0;
  undefined1 *local_9d8;
  undefined1 *local_9d0;
  char *local_9c8;
  char *local_9c0;
  undefined1 *local_9b8;
  undefined1 *local_9b0;
  char *local_9a8;
  char *local_9a0;
  char *local_968;
  char *local_960;
  undefined1 *local_958;
  undefined1 *local_950;
  char *local_948;
  char *local_940;
  undefined1 *local_938;
  undefined1 *local_930;
  char *local_928;
  char *local_920;
  undefined1 *local_918;
  undefined1 *local_910;
  char *local_908;
  char *local_900;
  undefined1 *local_8f8;
  undefined1 *local_8f0;
  char *local_8e8;
  char *local_8e0;
  char *local_8a8;
  char *local_8a0;
  undefined1 *local_898;
  undefined1 *local_890;
  char *local_888;
  char *local_880;
  undefined1 *local_878;
  undefined1 *local_870;
  char *local_868;
  char *local_860;
  char *local_828;
  char *local_820;
  undefined1 *local_818;
  undefined1 *local_810;
  char *local_808;
  char *local_800;
  undefined1 *local_7f8;
  undefined1 *local_7f0;
  char *local_7e8;
  char *local_7e0;
  undefined1 *local_7d8;
  undefined1 *local_7d0;
  char *local_7c8;
  char *local_7c0;
  undefined1 *local_7b8;
  undefined1 *local_7b0;
  char *local_7a8;
  char *local_7a0;
  undefined1 *local_798;
  undefined1 *local_790;
  char *local_788;
  char *local_780;
  undefined1 *local_778;
  undefined1 *local_770;
  char *local_768;
  char *local_760;
  undefined1 *local_758;
  undefined1 *local_750;
  char *local_748;
  char *local_740;
  undefined1 *local_738;
  undefined1 *local_730;
  char *local_728;
  char *local_720;
  undefined1 *local_718;
  undefined1 *local_710;
  char *local_708;
  char *local_700;
  undefined1 *local_6f8;
  undefined1 *local_6f0;
  char *local_6e8;
  char *local_6e0;
  undefined1 *local_6d8;
  undefined1 *local_6d0;
  char *local_6c8;
  char *local_6c0;
  undefined1 *local_6b8;
  undefined1 *local_6b0;
  char *local_6a8;
  char *local_6a0;
  undefined1 *local_698;
  undefined1 *local_690;
  char *local_688;
  char *local_680;
  undefined1 *local_678;
  undefined1 *local_670;
  char *local_668;
  char *local_660;
  undefined1 *local_658;
  undefined1 *local_650;
  char *local_648;
  char *local_640;
  undefined1 *local_638;
  undefined1 *local_630;
  char *local_628;
  char *local_620;
  undefined1 *local_618;
  undefined1 *local_610;
  char *local_608;
  char *local_600;
  undefined1 *local_5f8;
  undefined1 *local_5f0;
  char *local_5e8;
  char *local_5e0;
  undefined1 *local_5d8;
  undefined1 *local_5d0;
  char *local_5c8;
  char *local_5c0;
  undefined1 *local_5b8;
  undefined1 *local_5b0;
  char *local_5a8;
  char *local_5a0;
  undefined1 *local_598;
  undefined1 *local_590;
  char *local_588;
  char *local_580;
  undefined1 *local_578;
  undefined1 *local_570;
  char *local_568;
  char *local_560;
  undefined1 *local_558;
  undefined1 *local_550;
  char *local_548;
  char *local_540;
  undefined1 *local_538;
  undefined1 *local_530;
  char *local_528;
  char *local_520;
  undefined1 *local_518;
  undefined1 *local_510;
  char *local_508;
  char *local_500;
  undefined1 *local_4f8;
  undefined1 *local_4f0;
  char *local_4e8;
  char *local_4e0;
  undefined1 *local_4d8;
  undefined1 *local_4d0;
  char *local_4c8;
  char *local_4c0;
  undefined1 *local_4b8;
  undefined1 *local_4b0;
  char *local_4a8;
  char *local_4a0;
  undefined1 *local_498;
  undefined1 *local_490;
  char *local_488;
  char *local_480;
  undefined1 *local_478;
  undefined1 *local_470;
  char *local_468;
  char *local_460;
  anon_class_8_1_89897ddb set_foo;
  lazy_ostream local_450;
  undefined1 *local_440;
  char **local_438;
  char *local_430;
  UniValue *local_428;
  char **local_420;
  char *local_418;
  UniValue **local_410;
  element_type *local_408;
  shared_count sStack_400;
  undefined1 *local_3f8;
  undefined8 local_3f0;
  undefined1 local_3e8;
  undefined7 uStack_3e7;
  undefined1 uStack_3e0;
  undefined4 local_3df;
  undefined2 local_3db;
  char local_3d9;
  string local_3d8;
  undefined1 *local_3b8;
  undefined8 local_3b0;
  undefined1 local_3a8;
  undefined7 uStack_3a7;
  undefined1 uStack_3a0;
  undefined4 local_39f;
  undefined2 local_39b;
  char local_399;
  string local_398;
  undefined1 *local_378;
  undefined8 local_370;
  undefined1 local_368;
  undefined7 uStack_367;
  undefined1 uStack_360;
  undefined4 local_35f;
  undefined2 local_35b;
  char local_359;
  string local_358;
  undefined1 local_338 [32];
  undefined1 local_318 [16];
  undefined1 local_308 [16];
  undefined1 local_2f8 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2e0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_2d0;
  vector<UniValue,_std::allocator<UniValue>_> vStack_2b8;
  ArgsManager args;
  undefined1 local_58 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_48;
  long local_38;
  
  local_1030 = (undefined1 *)0x0;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  ArgsManager::ArgsManager(&args);
  local_2f8._0_8_ = local_2f8 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2f8,"-foo","");
  local_2e0._8_4_ = 1;
  __l._M_len = 1;
  __l._M_array = (iterator)local_2f8;
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  ::vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
            *)local_58,__l,(allocator_type *)&local_450);
  SetupArgs(&args,(vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                   *)local_58);
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
             *)local_58);
  if ((undefined1 *)local_2f8._0_8_ != local_2f8 + 0x10) {
    operator_delete((void *)local_2f8._0_8_,local_2f8._16_8_ + 1);
  }
  set_foo.args = &args;
  ::UniValue::UniValue<const_char_(&)[4],_char[4],_true>
            ((UniValue *)local_2f8,(char (*) [4])0xe7f622);
  test_method::anon_class_8_1_89897ddb::operator()(&set_foo,(SettingsValue *)local_2f8);
  std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&vStack_2b8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_2d0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2f8._8_8_ != &local_2e0) {
    operator_delete((void *)local_2f8._8_8_,CONCAT71(local_2e0._1_7_,local_2e0._M_local_buf[0]) + 1)
    ;
  }
  local_468 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/getarg_tests.cpp"
  ;
  local_460 = "";
  local_478 = &boost::unit_test::basic_cstring<char_const>::null;
  local_470 = &boost::unit_test::basic_cstring<char_const>::null;
  file.m_end = (iterator)0x45;
  file.m_begin = (iterator)&local_468;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_478,msg);
  local_318[8] = false;
  local_318._0_8_ = &PTR__lazy_ostream_013abb30;
  local_308._0_8_ = boost::unit_test::lazy_ostream::inst;
  local_308._8_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  local_358._M_dataplus._M_p = (pointer)&local_358.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_358,"foo","");
  ArgsManager::GetSetting((SettingsValue *)local_2f8,&args,&local_358);
  ::UniValue::write_abi_cxx11_((UniValue *)local_338,(int)local_2f8,(void *)0x0,0);
  iVar7 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_338,
                     "\"str\"");
  local_410 = (UniValue **)CONCAT71(local_410._1_7_,iVar7 == 0);
  local_408 = (element_type *)0x0;
  sStack_400.pi_ = (sp_counted_base *)0x0;
  local_420 = (char **)0xe96108;
  local_418 = "";
  aStack_48._8_8_ = &local_428;
  local_58._8_8_ = local_58._8_8_ & 0xffffffffffffff00;
  local_58._0_8_ = &PTR__lazy_ostream_013abbf0;
  aStack_48._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_438 = &local_430;
  local_430 = "\"str\"";
  local_450.m_empty = false;
  local_450._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ac0b0;
  local_440 = boost::unit_test::lazy_ostream::inst;
  pvVar8 = (iterator)0x1;
  pvVar9 = (iterator)0x2;
  local_428 = (UniValue *)local_338;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_410,(lazy_ostream *)local_318,1,2,REQUIRE,0xe961c9,
             (size_t)&local_420,0x45,local_58,"\"\\\"str\\\"\"",&local_450);
  boost::detail::shared_count::~shared_count(&sStack_400);
  pcVar1 = local_338 + 0x10;
  if ((pointer)local_338._0_8_ != pcVar1) {
    operator_delete((void *)local_338._0_8_,local_338._16_8_ + 1);
  }
  std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&vStack_2b8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_2d0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2f8._8_8_ != &local_2e0) {
    operator_delete((void *)local_2f8._8_8_,CONCAT71(local_2e0._1_7_,local_2e0._M_local_buf[0]) + 1)
    ;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_358._M_dataplus._M_p != &local_358.field_2) {
    operator_delete(local_358._M_dataplus._M_p,local_358.field_2._M_allocated_capacity + 1);
  }
  local_488 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/getarg_tests.cpp"
  ;
  local_480 = "";
  local_498 = &boost::unit_test::basic_cstring<char_const>::null;
  local_490 = &boost::unit_test::basic_cstring<char_const>::null;
  file_00.m_end = (iterator)0x46;
  file_00.m_begin = (iterator)&local_488;
  msg_00.m_end = pvVar9;
  msg_00.m_begin = pvVar8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_498,
             msg_00);
  local_450.m_empty = false;
  local_450._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013abb30;
  local_440 = boost::unit_test::lazy_ostream::inst;
  local_438 = (char **)0xf6cf21;
  local_338._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_338,"foo","");
  local_358._M_dataplus._M_p = (pointer)&local_358.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_358,"default","");
  ArgsManager::GetArg((string *)local_318,&args,(string *)local_338,&local_358);
  iVar7 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_318,
                     "str");
  local_410 = (UniValue **)CONCAT71(local_410._1_7_,iVar7 == 0);
  local_408 = (element_type *)0x0;
  sStack_400.pi_ = (sp_counted_base *)0x0;
  local_420 = (char **)0xe96108;
  local_418 = "";
  local_2f8._8_8_ = local_2f8._8_8_ & 0xffffffffffffff00;
  local_2f8._0_8_ = &PTR__lazy_ostream_013abbf0;
  local_2f8._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_2e0._M_local_buf[0] = (char)&local_428;
  local_2e0._1_7_ = (undefined7)((ulong)&local_428 >> 8);
  local_430 = "str";
  local_58._8_8_ = local_58._8_8_ & 0xffffffffffffff00;
  local_58._0_8_ = &PTR__lazy_ostream_013ac330;
  aStack_48._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  aStack_48._8_8_ = &local_430;
  pvVar8 = (iterator)0x1;
  pvVar9 = (iterator)0x2;
  local_428 = (UniValue *)local_318;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_410,&local_450,1,2,REQUIRE,0xe961f8,(size_t)&local_420,0x46,
             local_2f8,"\"str\"",local_58);
  boost::detail::shared_count::~shared_count(&sStack_400);
  if ((undefined1 *)local_318._0_8_ != local_308) {
    operator_delete((void *)local_318._0_8_,(ulong)(local_308._0_8_ + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_358._M_dataplus._M_p != &local_358.field_2) {
    operator_delete(local_358._M_dataplus._M_p,local_358.field_2._M_allocated_capacity + 1);
  }
  if ((pointer)local_338._0_8_ != pcVar1) {
    operator_delete((void *)local_338._0_8_,local_338._16_8_ + 1);
  }
  local_4a8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/getarg_tests.cpp"
  ;
  local_4a0 = "";
  local_4b8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_4b0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_01.m_end = (iterator)0x47;
  file_01.m_begin = (iterator)&local_4a8;
  msg_01.m_end = pvVar9;
  msg_01.m_begin = pvVar8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_4b8,
             msg_01);
  local_450.m_empty = false;
  local_450._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013abb30;
  local_440 = boost::unit_test::lazy_ostream::inst;
  local_438 = (char **)0xf6cf21;
  local_318._0_8_ = local_308;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_318,"foo","");
  local_428 = (UniValue *)ArgsManager::GetIntArg(&args,(string *)local_318,100);
  local_338[0] = local_428 == (UniValue *)0x0;
  local_430 = (char *)((ulong)local_430 & 0xffffffff00000000);
  local_338._8_8_ = (pointer)0x0;
  local_338._16_8_ = 0;
  local_358._M_dataplus._M_p =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/getarg_tests.cpp"
  ;
  local_358._M_string_length = 0xe9616d;
  local_410 = &local_428;
  local_2f8._8_8_ = local_2f8._8_8_ & 0xffffffffffffff00;
  local_2f8._0_8_ = &PTR__lazy_ostream_013abed0;
  local_2f8._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_2e0._M_local_buf[0] = (char)(assertion_result *)&local_410;
  uVar4 = local_2e0._M_local_buf[0];
  local_2e0._1_7_ = (undefined7)((ulong)&local_410 >> 8);
  uVar5 = local_2e0._1_7_;
  local_420 = &local_430;
  local_58._8_8_ = local_58._8_8_ & 0xffffffffffffff00;
  local_58._0_8_ = &PTR__lazy_ostream_013abcf0;
  aStack_48._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  pvVar8 = (iterator)0x1;
  pvVar9 = (iterator)0x2;
  aStack_48._8_8_ = &local_420;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_338,&local_450,1,2,REQUIRE,0xe96216,(size_t)&local_358,0x47,
             local_2f8,"0",local_58);
  boost::detail::shared_count::~shared_count((shared_count *)(local_338 + 0x10));
  if ((undefined1 *)local_318._0_8_ != local_308) {
    operator_delete((void *)local_318._0_8_,(ulong)(local_308._0_8_ + 1));
  }
  local_4c8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/getarg_tests.cpp"
  ;
  local_4c0 = "";
  local_4d8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_4d0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_02.m_end = (iterator)0x48;
  file_02.m_begin = (iterator)&local_4c8;
  msg_02.m_end = pvVar9;
  msg_02.m_begin = pvVar8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)&local_4d8,
             msg_02);
  local_450.m_empty = false;
  local_450._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013abb30;
  local_440 = boost::unit_test::lazy_ostream::inst;
  local_438 = (char **)0xf6cf21;
  local_318._0_8_ = local_308;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_318,"foo","");
  bVar6 = ArgsManager::GetBoolArg(&args,(string *)local_318,true);
  local_428 = (UniValue *)CONCAT71(local_428._1_7_,bVar6);
  local_430 = (char *)((ulong)local_430 & 0xffffffffffffff00);
  local_338[0] = !bVar6;
  local_338._8_8_ = (pointer)0x0;
  local_338._16_8_ = 0;
  local_358._M_dataplus._M_p =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/getarg_tests.cpp"
  ;
  local_358._M_string_length = 0xe9616d;
  local_410 = &local_428;
  local_2f8._8_8_ = local_2f8._8_8_ & 0xffffffffffffff00;
  local_2f8._0_8_ = &PTR__lazy_ostream_013abe90;
  local_2f8._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_420 = &local_430;
  local_58._8_8_ = local_58._8_8_ & 0xffffffffffffff00;
  local_58._0_8_ = &PTR__lazy_ostream_013abe90;
  aStack_48._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  pvVar8 = (iterator)0x1;
  pvVar9 = (iterator)0x2;
  local_2e0._M_local_buf[0] = uVar4;
  local_2e0._1_7_ = uVar5;
  aStack_48._8_8_ = &local_420;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_338,&local_450,1,2,REQUIRE,0xe96231,(size_t)&local_358,0x48,
             local_2f8,"false",local_58);
  boost::detail::shared_count::~shared_count((shared_count *)(local_338 + 0x10));
  if ((undefined1 *)local_318._0_8_ != local_308) {
    operator_delete((void *)local_318._0_8_,(ulong)(local_308._0_8_ + 1));
  }
  local_4e8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/getarg_tests.cpp"
  ;
  local_4e0 = "";
  local_4f8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_4f0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_03.m_end = (iterator)0x49;
  file_03.m_begin = (iterator)&local_4e8;
  msg_03.m_end = pvVar9;
  msg_03.m_begin = pvVar8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_03,(size_t)&local_4f8,
             msg_03);
  local_450.m_empty = false;
  local_450._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013abb30;
  local_440 = boost::unit_test::lazy_ostream::inst;
  local_438 = (char **)0xf6cf21;
  local_318._0_8_ = local_308;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_318,"foo","");
  bVar6 = ArgsManager::GetBoolArg(&args,(string *)local_318,false);
  local_428 = (UniValue *)CONCAT71(local_428._1_7_,bVar6);
  local_430 = (char *)((ulong)local_430 & 0xffffffffffffff00);
  local_338[0] = !bVar6;
  local_338._8_8_ = (pointer)0x0;
  local_338._16_8_ = 0;
  local_358._M_dataplus._M_p =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/getarg_tests.cpp"
  ;
  local_358._M_string_length = 0xe9616d;
  local_410 = &local_428;
  local_2f8._8_8_ = local_2f8._8_8_ & 0xffffffffffffff00;
  local_2f8._0_8_ = &PTR__lazy_ostream_013abe90;
  local_2f8._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_420 = &local_430;
  local_58._8_8_ = local_58._8_8_ & 0xffffffffffffff00;
  local_58._0_8_ = &PTR__lazy_ostream_013abe90;
  aStack_48._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  pvVar8 = (iterator)0x1;
  pvVar9 = (iterator)0x2;
  local_2e0._M_local_buf[0] = uVar4;
  local_2e0._1_7_ = uVar5;
  aStack_48._8_8_ = &local_420;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_338,&local_450,1,2,REQUIRE,0xe9624e,(size_t)&local_358,0x49,
             local_2f8,"false",local_58);
  psVar2 = (shared_count *)(local_338 + 0x10);
  boost::detail::shared_count::~shared_count(psVar2);
  if ((undefined1 *)local_318._0_8_ != local_308) {
    operator_delete((void *)local_318._0_8_,(ulong)(local_308._0_8_ + 1));
  }
  ::UniValue::UniValue<const_char_(&)[3],_char[3],_true>
            ((UniValue *)local_2f8,(char (*) [3])0xf86228);
  test_method::anon_class_8_1_89897ddb::operator()(&set_foo,(SettingsValue *)local_2f8);
  std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&vStack_2b8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_2d0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2f8._8_8_ != &local_2e0) {
    operator_delete((void *)local_2f8._8_8_,CONCAT71(local_2e0._1_7_,local_2e0._M_local_buf[0]) + 1)
    ;
  }
  local_508 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/getarg_tests.cpp"
  ;
  local_500 = "";
  local_518 = &boost::unit_test::basic_cstring<char_const>::null;
  local_510 = &boost::unit_test::basic_cstring<char_const>::null;
  file_04.m_end = (iterator)0x4c;
  file_04.m_begin = (iterator)&local_508;
  msg_04.m_end = pvVar9;
  msg_04.m_begin = pvVar8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_04,(size_t)&local_518,
             msg_04);
  local_318[8] = false;
  local_318._0_8_ = &PTR__lazy_ostream_013abb30;
  local_308._0_8_ = boost::unit_test::lazy_ostream::inst;
  local_308._8_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  local_358._M_dataplus._M_p = (pointer)&local_358.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_358,"foo","");
  ArgsManager::GetSetting((SettingsValue *)local_2f8,&args,&local_358);
  ::UniValue::write_abi_cxx11_((UniValue *)local_338,(int)local_2f8,(void *)0x0,0);
  iVar7 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_338,
                     "\"99\"");
  local_410 = (UniValue **)CONCAT71(local_410._1_7_,iVar7 == 0);
  local_408 = (element_type *)0x0;
  sStack_400.pi_ = (sp_counted_base *)0x0;
  local_420 = (char **)0xe96108;
  local_418 = "";
  local_58._8_8_ = local_58._8_8_ & 0xffffffffffffff00;
  local_58._0_8_ = &PTR__lazy_ostream_013abbf0;
  aStack_48._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  aStack_48._8_8_ = &local_428;
  local_430 = "\"99\"";
  local_450.m_empty = false;
  local_450._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ac430;
  local_440 = boost::unit_test::lazy_ostream::inst;
  local_438 = &local_430;
  pvVar8 = (iterator)0x1;
  pvVar9 = (iterator)0x2;
  local_428 = (UniValue *)local_338;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_410,(lazy_ostream *)local_318,1,2,REQUIRE,0xe961c9,
             (size_t)&local_420,0x4c,local_58,"\"\\\"99\\\"\"",&local_450);
  boost::detail::shared_count::~shared_count(&sStack_400);
  if ((shared_count *)local_338._0_8_ != psVar2) {
    operator_delete((void *)local_338._0_8_,local_338._16_8_ + 1);
  }
  std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&vStack_2b8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_2d0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2f8._8_8_ != &local_2e0) {
    operator_delete((void *)local_2f8._8_8_,CONCAT71(local_2e0._1_7_,local_2e0._M_local_buf[0]) + 1)
    ;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_358._M_dataplus._M_p != &local_358.field_2) {
    operator_delete(local_358._M_dataplus._M_p,local_358.field_2._M_allocated_capacity + 1);
  }
  local_528 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/getarg_tests.cpp"
  ;
  local_520 = "";
  local_538 = &boost::unit_test::basic_cstring<char_const>::null;
  local_530 = &boost::unit_test::basic_cstring<char_const>::null;
  file_05.m_end = (iterator)0x4d;
  file_05.m_begin = (iterator)&local_528;
  msg_05.m_end = pvVar9;
  msg_05.m_begin = pvVar8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_05,(size_t)&local_538,
             msg_05);
  local_450.m_empty = false;
  local_450._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013abb30;
  local_440 = boost::unit_test::lazy_ostream::inst;
  local_438 = (char **)0xf6cf21;
  local_338._0_8_ = psVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_338,"foo","");
  local_358._M_dataplus._M_p = (pointer)&local_358.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_358,"default","");
  ArgsManager::GetArg((string *)local_318,&args,(string *)local_338,&local_358);
  iVar7 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_318,
                     "99");
  local_410 = (UniValue **)CONCAT71(local_410._1_7_,iVar7 == 0);
  local_408 = (element_type *)0x0;
  sStack_400.pi_ = (sp_counted_base *)0x0;
  local_420 = (char **)0xe96108;
  local_418 = "";
  local_2f8._8_8_ = local_2f8._8_8_ & 0xffffffffffffff00;
  local_2f8._0_8_ = &PTR__lazy_ostream_013abbf0;
  local_2f8._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_2e0._M_local_buf[0] = (char)&local_428;
  local_2e0._1_7_ = (undefined7)((ulong)&local_428 >> 8);
  local_430 = "99";
  local_58._8_8_ = local_58._8_8_ & 0xffffffffffffff00;
  local_58._0_8_ = &PTR__lazy_ostream_013ad300;
  aStack_48._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  aStack_48._8_8_ = &local_430;
  pvVar8 = (iterator)0x1;
  pvVar9 = (iterator)0x2;
  local_428 = (UniValue *)local_318;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_410,&local_450,1,2,REQUIRE,0xe961f8,(size_t)&local_420,0x4d,
             local_2f8,"\"99\"",local_58);
  boost::detail::shared_count::~shared_count(&sStack_400);
  if ((undefined1 *)local_318._0_8_ != local_308) {
    operator_delete((void *)local_318._0_8_,(ulong)(local_308._0_8_ + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_358._M_dataplus._M_p != &local_358.field_2) {
    operator_delete(local_358._M_dataplus._M_p,local_358.field_2._M_allocated_capacity + 1);
  }
  if ((shared_count *)local_338._0_8_ != psVar2) {
    operator_delete((void *)local_338._0_8_,local_338._16_8_ + 1);
  }
  local_548 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/getarg_tests.cpp"
  ;
  local_540 = "";
  local_558 = &boost::unit_test::basic_cstring<char_const>::null;
  local_550 = &boost::unit_test::basic_cstring<char_const>::null;
  file_06.m_end = (iterator)0x4e;
  file_06.m_begin = (iterator)&local_548;
  msg_06.m_end = pvVar9;
  msg_06.m_begin = pvVar8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_06,(size_t)&local_558,
             msg_06);
  local_450.m_empty = false;
  local_450._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013abb30;
  local_440 = boost::unit_test::lazy_ostream::inst;
  local_438 = (char **)0xf6cf21;
  local_318._0_8_ = local_308;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_318,"foo","");
  local_428 = (UniValue *)ArgsManager::GetIntArg(&args,(string *)local_318,100);
  local_430 = (char *)CONCAT44(local_430._4_4_,99);
  local_338[0] = local_428 == (UniValue *)0x63;
  local_338._8_8_ = (pointer)0x0;
  local_338._16_8_ = 0;
  local_358._M_dataplus._M_p =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/getarg_tests.cpp"
  ;
  local_358._M_string_length = 0xe9616d;
  local_410 = &local_428;
  local_2f8._8_8_ = local_2f8._8_8_ & 0xffffffffffffff00;
  local_2f8._0_8_ = &PTR__lazy_ostream_013abed0;
  local_2f8._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_2e0._M_local_buf[0] = (char)(assertion_result *)&local_410;
  uVar4 = local_2e0._M_local_buf[0];
  local_2e0._1_7_ = (undefined7)((ulong)&local_410 >> 8);
  uVar5 = local_2e0._1_7_;
  local_420 = &local_430;
  local_58._8_8_ = local_58._8_8_ & 0xffffffffffffff00;
  local_58._0_8_ = &PTR__lazy_ostream_013abcf0;
  aStack_48._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  pvVar8 = (iterator)0x1;
  pvVar9 = (iterator)0x2;
  aStack_48._8_8_ = &local_420;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_338,&local_450,1,2,REQUIRE,0xe96216,(size_t)&local_358,0x4e,
             local_2f8,"99",local_58);
  boost::detail::shared_count::~shared_count((shared_count *)(local_338 + 0x10));
  if ((undefined1 *)local_318._0_8_ != local_308) {
    operator_delete((void *)local_318._0_8_,(ulong)(local_308._0_8_ + 1));
  }
  local_568 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/getarg_tests.cpp"
  ;
  local_560 = "";
  local_578 = &boost::unit_test::basic_cstring<char_const>::null;
  local_570 = &boost::unit_test::basic_cstring<char_const>::null;
  file_07.m_end = (iterator)0x4f;
  file_07.m_begin = (iterator)&local_568;
  msg_07.m_end = pvVar9;
  msg_07.m_begin = pvVar8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_07,(size_t)&local_578,
             msg_07);
  local_450.m_empty = false;
  local_450._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013abb30;
  local_440 = boost::unit_test::lazy_ostream::inst;
  local_438 = (char **)0xf6cf21;
  local_318._0_8_ = local_308;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_318,"foo","");
  bVar6 = ArgsManager::GetBoolArg(&args,(string *)local_318,true);
  local_428 = (UniValue *)CONCAT71(local_428._1_7_,bVar6);
  local_430 = (char *)CONCAT71(local_430._1_7_,1);
  local_338[0] = bVar6;
  local_338._8_8_ = (pointer)0x0;
  local_338._16_8_ = 0;
  local_358._M_dataplus._M_p =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/getarg_tests.cpp"
  ;
  local_358._M_string_length = 0xe9616d;
  local_410 = &local_428;
  local_2f8._8_8_ = local_2f8._8_8_ & 0xffffffffffffff00;
  local_2f8._0_8_ = &PTR__lazy_ostream_013abe90;
  local_2f8._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_420 = &local_430;
  local_58._8_8_ = local_58._8_8_ & 0xffffffffffffff00;
  local_58._0_8_ = &PTR__lazy_ostream_013abe90;
  aStack_48._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  pvVar8 = (iterator)0x1;
  pvVar9 = (iterator)0x2;
  local_2e0._M_local_buf[0] = uVar4;
  local_2e0._1_7_ = uVar5;
  aStack_48._8_8_ = &local_420;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_338,&local_450,1,2,REQUIRE,0xe96231,(size_t)&local_358,0x4f,
             local_2f8,"true",local_58);
  boost::detail::shared_count::~shared_count((shared_count *)(local_338 + 0x10));
  if ((undefined1 *)local_318._0_8_ != local_308) {
    operator_delete((void *)local_318._0_8_,(ulong)(local_308._0_8_ + 1));
  }
  local_588 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/getarg_tests.cpp"
  ;
  local_580 = "";
  local_598 = &boost::unit_test::basic_cstring<char_const>::null;
  local_590 = &boost::unit_test::basic_cstring<char_const>::null;
  file_08.m_end = &DAT_00000050;
  file_08.m_begin = (iterator)&local_588;
  msg_08.m_end = pvVar9;
  msg_08.m_begin = pvVar8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_08,(size_t)&local_598,
             msg_08);
  local_450.m_empty = false;
  local_450._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013abb30;
  local_440 = boost::unit_test::lazy_ostream::inst;
  local_438 = (char **)0xf6cf21;
  local_318._0_8_ = local_308;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_318,"foo","");
  bVar6 = ArgsManager::GetBoolArg(&args,(string *)local_318,false);
  local_428 = (UniValue *)CONCAT71(local_428._1_7_,bVar6);
  local_430 = (char *)CONCAT71(local_430._1_7_,1);
  local_338[0] = bVar6;
  local_338._8_8_ = (pointer)0x0;
  local_338._16_8_ = 0;
  local_358._M_dataplus._M_p =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/getarg_tests.cpp"
  ;
  local_358._M_string_length = 0xe9616d;
  local_410 = &local_428;
  local_2f8._8_8_ = local_2f8._8_8_ & 0xffffffffffffff00;
  local_2f8._0_8_ = &PTR__lazy_ostream_013abe90;
  local_2f8._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_420 = &local_430;
  local_58._8_8_ = local_58._8_8_ & 0xffffffffffffff00;
  local_58._0_8_ = &PTR__lazy_ostream_013abe90;
  aStack_48._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  pvVar8 = (iterator)0x1;
  pvVar9 = (iterator)0x2;
  local_2e0._M_local_buf[0] = uVar4;
  local_2e0._1_7_ = uVar5;
  aStack_48._8_8_ = &local_420;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_338,&local_450,1,2,REQUIRE,0xe9624e,(size_t)&local_358,0x50,
             local_2f8,"true",local_58);
  psVar2 = (shared_count *)(local_338 + 0x10);
  boost::detail::shared_count::~shared_count(psVar2);
  if ((undefined1 *)local_318._0_8_ != local_308) {
    operator_delete((void *)local_318._0_8_,(ulong)(local_308._0_8_ + 1));
  }
  ::UniValue::UniValue<const_char_(&)[5],_char[5],_true>((UniValue *)local_2f8,(char (*) [5])"3.25")
  ;
  test_method::anon_class_8_1_89897ddb::operator()(&set_foo,(SettingsValue *)local_2f8);
  std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&vStack_2b8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_2d0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2f8._8_8_ != &local_2e0) {
    operator_delete((void *)local_2f8._8_8_,CONCAT71(local_2e0._1_7_,local_2e0._M_local_buf[0]) + 1)
    ;
  }
  local_5a8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/getarg_tests.cpp"
  ;
  local_5a0 = "";
  local_5b8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_5b0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_09.m_end = (iterator)0x53;
  file_09.m_begin = (iterator)&local_5a8;
  msg_09.m_end = pvVar9;
  msg_09.m_begin = pvVar8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_09,(size_t)&local_5b8,
             msg_09);
  local_318[8] = false;
  local_318._0_8_ = &PTR__lazy_ostream_013abb30;
  local_308._0_8_ = boost::unit_test::lazy_ostream::inst;
  local_308._8_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  local_358._M_dataplus._M_p = (pointer)&local_358.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_358,"foo","");
  ArgsManager::GetSetting((SettingsValue *)local_2f8,&args,&local_358);
  ::UniValue::write_abi_cxx11_((UniValue *)local_338,(int)local_2f8,(void *)0x0,0);
  iVar7 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_338,
                     "\"3.25\"");
  local_410 = (UniValue **)CONCAT71(local_410._1_7_,iVar7 == 0);
  local_408 = (element_type *)0x0;
  sStack_400.pi_ = (sp_counted_base *)0x0;
  local_420 = (char **)0xe96108;
  local_418 = "";
  local_58._8_8_ = local_58._8_8_ & 0xffffffffffffff00;
  local_58._0_8_ = &PTR__lazy_ostream_013abbf0;
  aStack_48._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  aStack_48._8_8_ = &local_428;
  local_430 = "\"3.25\"";
  local_450.m_empty = false;
  local_450._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013abc30;
  local_440 = boost::unit_test::lazy_ostream::inst;
  local_438 = &local_430;
  pvVar8 = (iterator)0x1;
  pvVar9 = (iterator)0x2;
  local_428 = (UniValue *)local_338;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_410,(lazy_ostream *)local_318,1,2,REQUIRE,0xe961c9,
             (size_t)&local_420,0x53,local_58,"\"\\\"3.25\\\"\"",&local_450);
  boost::detail::shared_count::~shared_count(&sStack_400);
  if ((shared_count *)local_338._0_8_ != psVar2) {
    operator_delete((void *)local_338._0_8_,local_338._16_8_ + 1);
  }
  std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&vStack_2b8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_2d0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2f8._8_8_ != &local_2e0) {
    operator_delete((void *)local_2f8._8_8_,CONCAT71(local_2e0._1_7_,local_2e0._M_local_buf[0]) + 1)
    ;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_358._M_dataplus._M_p != &local_358.field_2) {
    operator_delete(local_358._M_dataplus._M_p,local_358.field_2._M_allocated_capacity + 1);
  }
  local_5c8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/getarg_tests.cpp"
  ;
  local_5c0 = "";
  local_5d8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_5d0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_10.m_end = (iterator)0x54;
  file_10.m_begin = (iterator)&local_5c8;
  msg_10.m_end = pvVar9;
  msg_10.m_begin = pvVar8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_10,(size_t)&local_5d8,
             msg_10);
  local_450.m_empty = false;
  local_450._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013abb30;
  local_440 = boost::unit_test::lazy_ostream::inst;
  local_438 = (char **)0xf6cf21;
  local_338._0_8_ = psVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_338,"foo","");
  local_358._M_dataplus._M_p = (pointer)&local_358.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_358,"default","");
  ArgsManager::GetArg((string *)local_318,&args,(string *)local_338,&local_358);
  iVar7 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_318,
                     "3.25");
  local_410 = (UniValue **)CONCAT71(local_410._1_7_,iVar7 == 0);
  local_408 = (element_type *)0x0;
  sStack_400.pi_ = (sp_counted_base *)0x0;
  local_420 = (char **)0xe96108;
  local_418 = "";
  local_2f8._8_8_ = local_2f8._8_8_ & 0xffffffffffffff00;
  local_2f8._0_8_ = &PTR__lazy_ostream_013abbf0;
  local_2f8._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_2e0._M_local_buf[0] = (char)&local_428;
  local_2e0._1_7_ = (undefined7)((ulong)&local_428 >> 8);
  local_430 = "3.25";
  local_58._8_8_ = local_58._8_8_ & 0xffffffffffffff00;
  local_58._0_8_ = &PTR__lazy_ostream_013ac430;
  aStack_48._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  aStack_48._8_8_ = &local_430;
  pvVar8 = (iterator)0x1;
  pvVar9 = (iterator)0x2;
  local_428 = (UniValue *)local_318;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_410,&local_450,1,2,REQUIRE,0xe961f8,(size_t)&local_420,0x54,
             local_2f8,"\"3.25\"",local_58);
  boost::detail::shared_count::~shared_count(&sStack_400);
  if ((undefined1 *)local_318._0_8_ != local_308) {
    operator_delete((void *)local_318._0_8_,(ulong)(local_308._0_8_ + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_358._M_dataplus._M_p != &local_358.field_2) {
    operator_delete(local_358._M_dataplus._M_p,local_358.field_2._M_allocated_capacity + 1);
  }
  if ((shared_count *)local_338._0_8_ != psVar2) {
    operator_delete((void *)local_338._0_8_,local_338._16_8_ + 1);
  }
  local_5e8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/getarg_tests.cpp"
  ;
  local_5e0 = "";
  local_5f8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_5f0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_11.m_end = (iterator)0x55;
  file_11.m_begin = (iterator)&local_5e8;
  msg_11.m_end = pvVar9;
  msg_11.m_begin = pvVar8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_11,(size_t)&local_5f8,
             msg_11);
  local_450.m_empty = false;
  local_450._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013abb30;
  local_440 = boost::unit_test::lazy_ostream::inst;
  local_438 = (char **)0xf6cf21;
  local_318._0_8_ = local_308;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_318,"foo","");
  local_428 = (UniValue *)ArgsManager::GetIntArg(&args,(string *)local_318,100);
  local_430 = (char *)CONCAT44(local_430._4_4_,3);
  local_338[0] = local_428 == (UniValue *)0x3;
  local_338._8_8_ = (pointer)0x0;
  local_338._16_8_ = 0;
  local_358._M_dataplus._M_p =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/getarg_tests.cpp"
  ;
  local_358._M_string_length = 0xe9616d;
  local_410 = &local_428;
  local_2f8._8_8_ = local_2f8._8_8_ & 0xffffffffffffff00;
  local_2f8._0_8_ = &PTR__lazy_ostream_013abed0;
  local_2f8._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_2e0._M_local_buf[0] = (char)(assertion_result *)&local_410;
  uVar4 = local_2e0._M_local_buf[0];
  local_2e0._1_7_ = (undefined7)((ulong)&local_410 >> 8);
  uVar5 = local_2e0._1_7_;
  local_420 = &local_430;
  local_58._8_8_ = local_58._8_8_ & 0xffffffffffffff00;
  local_58._0_8_ = &PTR__lazy_ostream_013abcf0;
  aStack_48._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  pvVar8 = (iterator)0x1;
  pvVar9 = (iterator)0x2;
  aStack_48._8_8_ = &local_420;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_338,&local_450,1,2,REQUIRE,0xe96216,(size_t)&local_358,0x55,
             local_2f8,"3",local_58);
  boost::detail::shared_count::~shared_count((shared_count *)(local_338 + 0x10));
  if ((undefined1 *)local_318._0_8_ != local_308) {
    operator_delete((void *)local_318._0_8_,(ulong)(local_308._0_8_ + 1));
  }
  local_608 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/getarg_tests.cpp"
  ;
  local_600 = "";
  local_618 = &boost::unit_test::basic_cstring<char_const>::null;
  local_610 = &boost::unit_test::basic_cstring<char_const>::null;
  file_12.m_end = (iterator)0x56;
  file_12.m_begin = (iterator)&local_608;
  msg_12.m_end = pvVar9;
  msg_12.m_begin = pvVar8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_12,(size_t)&local_618,
             msg_12);
  local_450.m_empty = false;
  local_450._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013abb30;
  local_440 = boost::unit_test::lazy_ostream::inst;
  local_438 = (char **)0xf6cf21;
  local_318._0_8_ = local_308;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_318,"foo","");
  bVar6 = ArgsManager::GetBoolArg(&args,(string *)local_318,true);
  local_428 = (UniValue *)CONCAT71(local_428._1_7_,bVar6);
  local_430 = (char *)CONCAT71(local_430._1_7_,1);
  local_338[0] = bVar6;
  local_338._8_8_ = (pointer)0x0;
  local_338._16_8_ = 0;
  local_358._M_dataplus._M_p =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/getarg_tests.cpp"
  ;
  local_358._M_string_length = 0xe9616d;
  local_410 = &local_428;
  local_2f8._8_8_ = local_2f8._8_8_ & 0xffffffffffffff00;
  local_2f8._0_8_ = &PTR__lazy_ostream_013abe90;
  local_2f8._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_420 = &local_430;
  local_58._8_8_ = local_58._8_8_ & 0xffffffffffffff00;
  local_58._0_8_ = &PTR__lazy_ostream_013abe90;
  aStack_48._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  pvVar8 = (iterator)0x1;
  pvVar9 = (iterator)0x2;
  local_2e0._M_local_buf[0] = uVar4;
  local_2e0._1_7_ = uVar5;
  aStack_48._8_8_ = &local_420;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_338,&local_450,1,2,REQUIRE,0xe96231,(size_t)&local_358,0x56,
             local_2f8,"true",local_58);
  boost::detail::shared_count::~shared_count((shared_count *)(local_338 + 0x10));
  if ((undefined1 *)local_318._0_8_ != local_308) {
    operator_delete((void *)local_318._0_8_,(ulong)(local_308._0_8_ + 1));
  }
  local_628 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/getarg_tests.cpp"
  ;
  local_620 = "";
  local_638 = &boost::unit_test::basic_cstring<char_const>::null;
  local_630 = &boost::unit_test::basic_cstring<char_const>::null;
  file_13.m_end = (iterator)0x57;
  file_13.m_begin = (iterator)&local_628;
  msg_13.m_end = pvVar9;
  msg_13.m_begin = pvVar8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_13,(size_t)&local_638,
             msg_13);
  local_450.m_empty = false;
  local_450._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013abb30;
  local_440 = boost::unit_test::lazy_ostream::inst;
  local_438 = (char **)0xf6cf21;
  local_318._0_8_ = local_308;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_318,"foo","");
  bVar6 = ArgsManager::GetBoolArg(&args,(string *)local_318,false);
  local_428 = (UniValue *)CONCAT71(local_428._1_7_,bVar6);
  local_430 = (char *)CONCAT71(local_430._1_7_,1);
  local_338[0] = bVar6;
  local_338._8_8_ = (pointer)0x0;
  local_338._16_8_ = 0;
  local_358._M_dataplus._M_p =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/getarg_tests.cpp"
  ;
  local_358._M_string_length = 0xe9616d;
  local_410 = &local_428;
  local_2f8._8_8_ = local_2f8._8_8_ & 0xffffffffffffff00;
  local_2f8._0_8_ = &PTR__lazy_ostream_013abe90;
  local_2f8._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_420 = &local_430;
  local_58._8_8_ = local_58._8_8_ & 0xffffffffffffff00;
  local_58._0_8_ = &PTR__lazy_ostream_013abe90;
  aStack_48._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  pvVar8 = (iterator)0x1;
  pvVar9 = (iterator)0x2;
  local_2e0._M_local_buf[0] = uVar4;
  local_2e0._1_7_ = uVar5;
  aStack_48._8_8_ = &local_420;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_338,&local_450,1,2,REQUIRE,0xe9624e,(size_t)&local_358,0x57,
             local_2f8,"true",local_58);
  psVar2 = (shared_count *)(local_338 + 0x10);
  boost::detail::shared_count::~shared_count(psVar2);
  if ((undefined1 *)local_318._0_8_ != local_308) {
    operator_delete((void *)local_318._0_8_,(ulong)(local_308._0_8_ + 1));
  }
  ::UniValue::UniValue<const_char_(&)[2],_char[2],_true>
            ((UniValue *)local_2f8,(char (*) [2])0xfbe1bd);
  test_method::anon_class_8_1_89897ddb::operator()(&set_foo,(SettingsValue *)local_2f8);
  std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&vStack_2b8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_2d0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2f8._8_8_ != &local_2e0) {
    operator_delete((void *)local_2f8._8_8_,CONCAT71(local_2e0._1_7_,local_2e0._M_local_buf[0]) + 1)
    ;
  }
  local_648 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/getarg_tests.cpp"
  ;
  local_640 = "";
  local_658 = &boost::unit_test::basic_cstring<char_const>::null;
  local_650 = &boost::unit_test::basic_cstring<char_const>::null;
  file_14.m_end = (iterator)0x5a;
  file_14.m_begin = (iterator)&local_648;
  msg_14.m_end = pvVar9;
  msg_14.m_begin = pvVar8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_14,(size_t)&local_658,
             msg_14);
  local_318[8] = false;
  local_318._0_8_ = &PTR__lazy_ostream_013abb30;
  local_308._0_8_ = boost::unit_test::lazy_ostream::inst;
  local_308._8_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  local_358._M_dataplus._M_p = (pointer)&local_358.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_358,"foo","");
  ArgsManager::GetSetting((SettingsValue *)local_2f8,&args,&local_358);
  ::UniValue::write_abi_cxx11_((UniValue *)local_338,(int)local_2f8,(void *)0x0,0);
  iVar7 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_338,
                     "\"0\"");
  local_410 = (UniValue **)CONCAT71(local_410._1_7_,iVar7 == 0);
  local_408 = (element_type *)0x0;
  sStack_400.pi_ = (sp_counted_base *)0x0;
  local_420 = (char **)0xe96108;
  local_418 = "";
  local_58._8_8_ = local_58._8_8_ & 0xffffffffffffff00;
  local_58._0_8_ = &PTR__lazy_ostream_013abbf0;
  aStack_48._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  aStack_48._8_8_ = &local_428;
  local_430 = "\"0\"";
  local_450.m_empty = false;
  local_450._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ac330;
  local_440 = boost::unit_test::lazy_ostream::inst;
  local_438 = &local_430;
  pvVar8 = (iterator)0x1;
  pvVar9 = (iterator)0x2;
  local_428 = (UniValue *)local_338;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_410,(lazy_ostream *)local_318,1,2,REQUIRE,0xe961c9,
             (size_t)&local_420,0x5a,local_58,"\"\\\"0\\\"\"",&local_450);
  boost::detail::shared_count::~shared_count(&sStack_400);
  if ((shared_count *)local_338._0_8_ != psVar2) {
    operator_delete((void *)local_338._0_8_,local_338._16_8_ + 1);
  }
  std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&vStack_2b8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_2d0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2f8._8_8_ != &local_2e0) {
    operator_delete((void *)local_2f8._8_8_,CONCAT71(local_2e0._1_7_,local_2e0._M_local_buf[0]) + 1)
    ;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_358._M_dataplus._M_p != &local_358.field_2) {
    operator_delete(local_358._M_dataplus._M_p,local_358.field_2._M_allocated_capacity + 1);
  }
  local_668 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/getarg_tests.cpp"
  ;
  local_660 = "";
  local_678 = &boost::unit_test::basic_cstring<char_const>::null;
  local_670 = &boost::unit_test::basic_cstring<char_const>::null;
  file_15.m_end = (iterator)0x5b;
  file_15.m_begin = (iterator)&local_668;
  msg_15.m_end = pvVar9;
  msg_15.m_begin = pvVar8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_15,(size_t)&local_678,
             msg_15);
  local_450.m_empty = false;
  local_450._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013abb30;
  local_440 = boost::unit_test::lazy_ostream::inst;
  local_438 = (char **)0xf6cf21;
  local_338._0_8_ = psVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_338,"foo","");
  local_358._M_dataplus._M_p = (pointer)&local_358.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_358,"default","");
  ArgsManager::GetArg((string *)local_318,&args,(string *)local_338,&local_358);
  iVar7 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_318,
                     "0");
  local_410 = (UniValue **)CONCAT71(local_410._1_7_,iVar7 == 0);
  local_408 = (element_type *)0x0;
  sStack_400.pi_ = (sp_counted_base *)0x0;
  local_420 = (char **)0xe96108;
  local_418 = "";
  local_2f8._8_8_ = local_2f8._8_8_ & 0xffffffffffffff00;
  local_2f8._0_8_ = &PTR__lazy_ostream_013abbf0;
  local_2f8._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_2e0._M_local_buf[0] = (char)&local_428;
  local_2e0._1_7_ = (undefined7)((ulong)&local_428 >> 8);
  local_430 = "0";
  local_58._8_8_ = local_58._8_8_ & 0xffffffffffffff00;
  local_58._0_8_ = &PTR__lazy_ostream_013ac2b0;
  aStack_48._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  aStack_48._8_8_ = &local_430;
  pvVar8 = (iterator)0x1;
  pvVar9 = (iterator)0x2;
  local_428 = (UniValue *)local_318;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_410,&local_450,1,2,REQUIRE,0xe961f8,(size_t)&local_420,0x5b,
             local_2f8,"\"0\"",local_58);
  boost::detail::shared_count::~shared_count(&sStack_400);
  if ((undefined1 *)local_318._0_8_ != local_308) {
    operator_delete((void *)local_318._0_8_,(ulong)(local_308._0_8_ + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_358._M_dataplus._M_p != &local_358.field_2) {
    operator_delete(local_358._M_dataplus._M_p,local_358.field_2._M_allocated_capacity + 1);
  }
  if ((shared_count *)local_338._0_8_ != psVar2) {
    operator_delete((void *)local_338._0_8_,local_338._16_8_ + 1);
  }
  local_688 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/getarg_tests.cpp"
  ;
  local_680 = "";
  local_698 = &boost::unit_test::basic_cstring<char_const>::null;
  local_690 = &boost::unit_test::basic_cstring<char_const>::null;
  file_16.m_end = (iterator)0x5c;
  file_16.m_begin = (iterator)&local_688;
  msg_16.m_end = pvVar9;
  msg_16.m_begin = pvVar8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_16,(size_t)&local_698,
             msg_16);
  local_450.m_empty = false;
  local_450._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013abb30;
  local_440 = boost::unit_test::lazy_ostream::inst;
  local_438 = (char **)0xf6cf21;
  local_318._0_8_ = local_308;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_318,"foo","");
  local_428 = (UniValue *)ArgsManager::GetIntArg(&args,(string *)local_318,100);
  local_430 = (char *)((ulong)local_430 & 0xffffffff00000000);
  local_338[0] = local_428 == (UniValue *)0x0;
  local_338._8_8_ = (pointer)0x0;
  local_338._16_8_ = 0;
  local_358._M_dataplus._M_p =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/getarg_tests.cpp"
  ;
  local_358._M_string_length = 0xe9616d;
  local_410 = &local_428;
  local_2f8._8_8_ = local_2f8._8_8_ & 0xffffffffffffff00;
  local_2f8._0_8_ = &PTR__lazy_ostream_013abed0;
  local_2f8._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_2e0._M_local_buf[0] = (char)(assertion_result *)&local_410;
  uVar4 = local_2e0._M_local_buf[0];
  local_2e0._1_7_ = (undefined7)((ulong)&local_410 >> 8);
  uVar5 = local_2e0._1_7_;
  local_420 = &local_430;
  local_58._8_8_ = local_58._8_8_ & 0xffffffffffffff00;
  local_58._0_8_ = &PTR__lazy_ostream_013abcf0;
  aStack_48._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  pvVar8 = (iterator)0x1;
  pvVar9 = (iterator)0x2;
  aStack_48._8_8_ = &local_420;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_338,&local_450,1,2,REQUIRE,0xe96216,(size_t)&local_358,0x5c,
             local_2f8,"0",local_58);
  boost::detail::shared_count::~shared_count((shared_count *)(local_338 + 0x10));
  if ((undefined1 *)local_318._0_8_ != local_308) {
    operator_delete((void *)local_318._0_8_,(ulong)(local_308._0_8_ + 1));
  }
  local_6a8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/getarg_tests.cpp"
  ;
  local_6a0 = "";
  local_6b8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_6b0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_17.m_end = (iterator)0x5d;
  file_17.m_begin = (iterator)&local_6a8;
  msg_17.m_end = pvVar9;
  msg_17.m_begin = pvVar8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_17,(size_t)&local_6b8,
             msg_17);
  local_450.m_empty = false;
  local_450._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013abb30;
  local_440 = boost::unit_test::lazy_ostream::inst;
  local_438 = (char **)0xf6cf21;
  local_318._0_8_ = local_308;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_318,"foo","");
  bVar6 = ArgsManager::GetBoolArg(&args,(string *)local_318,true);
  local_428 = (UniValue *)CONCAT71(local_428._1_7_,bVar6);
  local_430 = (char *)((ulong)local_430 & 0xffffffffffffff00);
  local_338[0] = !bVar6;
  local_338._8_8_ = (pointer)0x0;
  local_338._16_8_ = 0;
  local_358._M_dataplus._M_p =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/getarg_tests.cpp"
  ;
  local_358._M_string_length = 0xe9616d;
  local_410 = &local_428;
  local_2f8._8_8_ = local_2f8._8_8_ & 0xffffffffffffff00;
  local_2f8._0_8_ = &PTR__lazy_ostream_013abe90;
  local_2f8._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_420 = &local_430;
  local_58._8_8_ = local_58._8_8_ & 0xffffffffffffff00;
  local_58._0_8_ = &PTR__lazy_ostream_013abe90;
  aStack_48._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  pvVar8 = (iterator)0x1;
  pvVar9 = (iterator)0x2;
  local_2e0._M_local_buf[0] = uVar4;
  local_2e0._1_7_ = uVar5;
  aStack_48._8_8_ = &local_420;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_338,&local_450,1,2,REQUIRE,0xe96231,(size_t)&local_358,0x5d,
             local_2f8,"false",local_58);
  boost::detail::shared_count::~shared_count((shared_count *)(local_338 + 0x10));
  if ((undefined1 *)local_318._0_8_ != local_308) {
    operator_delete((void *)local_318._0_8_,(ulong)(local_308._0_8_ + 1));
  }
  local_6c8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/getarg_tests.cpp"
  ;
  local_6c0 = "";
  local_6d8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_6d0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_18.m_end = (iterator)0x5e;
  file_18.m_begin = (iterator)&local_6c8;
  msg_18.m_end = pvVar9;
  msg_18.m_begin = pvVar8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_18,(size_t)&local_6d8,
             msg_18);
  local_450.m_empty = false;
  local_450._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013abb30;
  local_440 = boost::unit_test::lazy_ostream::inst;
  local_438 = (char **)0xf6cf21;
  local_318._0_8_ = local_308;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_318,"foo","");
  bVar6 = ArgsManager::GetBoolArg(&args,(string *)local_318,false);
  local_428 = (UniValue *)CONCAT71(local_428._1_7_,bVar6);
  local_430 = (char *)((ulong)local_430 & 0xffffffffffffff00);
  local_338[0] = !bVar6;
  local_338._8_8_ = (pointer)0x0;
  local_338._16_8_ = 0;
  local_358._M_dataplus._M_p =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/getarg_tests.cpp"
  ;
  local_358._M_string_length = 0xe9616d;
  local_410 = &local_428;
  local_2f8._8_8_ = local_2f8._8_8_ & 0xffffffffffffff00;
  local_2f8._0_8_ = &PTR__lazy_ostream_013abe90;
  local_2f8._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_420 = &local_430;
  local_58._8_8_ = local_58._8_8_ & 0xffffffffffffff00;
  local_58._0_8_ = &PTR__lazy_ostream_013abe90;
  aStack_48._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  pvVar8 = (iterator)0x1;
  pvVar9 = (iterator)0x2;
  local_2e0._M_local_buf[0] = uVar4;
  local_2e0._1_7_ = uVar5;
  aStack_48._8_8_ = &local_420;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_338,&local_450,1,2,REQUIRE,0xe9624e,(size_t)&local_358,0x5e,
             local_2f8,"false",local_58);
  boost::detail::shared_count::~shared_count((shared_count *)(local_338 + 0x10));
  if ((undefined1 *)local_318._0_8_ != local_308) {
    operator_delete((void *)local_318._0_8_,(ulong)(local_308._0_8_ + 1));
  }
  ::UniValue::UniValue<const_char_(&)[1],_char[1],_true>
            ((UniValue *)local_2f8,(char (*) [1])0xf6cf21);
  test_method::anon_class_8_1_89897ddb::operator()(&set_foo,(SettingsValue *)local_2f8);
  std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&vStack_2b8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_2d0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2f8._8_8_ != &local_2e0) {
    operator_delete((void *)local_2f8._8_8_,CONCAT71(local_2e0._1_7_,local_2e0._M_local_buf[0]) + 1)
    ;
  }
  local_6e8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/getarg_tests.cpp"
  ;
  local_6e0 = "";
  local_6f8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_6f0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_19.m_end = (iterator)0x61;
  file_19.m_begin = (iterator)&local_6e8;
  msg_19.m_end = pvVar9;
  msg_19.m_begin = pvVar8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_19,(size_t)&local_6f8,
             msg_19);
  local_318[8] = false;
  local_318._0_8_ = &PTR__lazy_ostream_013abb30;
  local_308._0_8_ = boost::unit_test::lazy_ostream::inst;
  local_308._8_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  local_358._M_dataplus._M_p = (pointer)&local_358.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_358,"foo","");
  ArgsManager::GetSetting((SettingsValue *)local_2f8,&args,&local_358);
  ::UniValue::write_abi_cxx11_((UniValue *)local_338,(int)local_2f8,(void *)0x0,0);
  iVar7 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_338,
                     "\"\"");
  local_410 = (UniValue **)CONCAT71(local_410._1_7_,iVar7 == 0);
  local_408 = (element_type *)0x0;
  sStack_400.pi_ = (sp_counted_base *)0x0;
  local_420 = (char **)0xe96108;
  local_418 = "";
  local_58._8_8_ = local_58._8_8_ & 0xffffffffffffff00;
  local_58._0_8_ = &PTR__lazy_ostream_013abbf0;
  aStack_48._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  aStack_48._8_8_ = &local_428;
  local_430 = "\"\"";
  local_450.m_empty = false;
  local_450._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ad300;
  local_440 = boost::unit_test::lazy_ostream::inst;
  local_438 = &local_430;
  pvVar8 = (iterator)0x1;
  pvVar9 = (iterator)0x2;
  local_428 = (UniValue *)local_338;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_410,(lazy_ostream *)local_318,1,2,REQUIRE,0xe961c9,
             (size_t)&local_420,0x61,local_58,"\"\\\"\\\"\"",&local_450);
  boost::detail::shared_count::~shared_count(&sStack_400);
  if ((undefined1 *)local_338._0_8_ != local_338 + 0x10) {
    operator_delete((void *)local_338._0_8_,local_338._16_8_ + 1);
  }
  std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&vStack_2b8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_2d0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2f8._8_8_ != &local_2e0) {
    operator_delete((void *)local_2f8._8_8_,CONCAT71(local_2e0._1_7_,local_2e0._M_local_buf[0]) + 1)
    ;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_358._M_dataplus._M_p != &local_358.field_2) {
    operator_delete(local_358._M_dataplus._M_p,local_358.field_2._M_allocated_capacity + 1);
  }
  local_708 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/getarg_tests.cpp"
  ;
  local_700 = "";
  local_718 = &boost::unit_test::basic_cstring<char_const>::null;
  local_710 = &boost::unit_test::basic_cstring<char_const>::null;
  file_20.m_end = (iterator)0x62;
  file_20.m_begin = (iterator)&local_708;
  msg_20.m_end = pvVar9;
  msg_20.m_begin = pvVar8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_20,(size_t)&local_718,
             msg_20);
  local_450.m_empty = false;
  local_450._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013abb30;
  local_440 = boost::unit_test::lazy_ostream::inst;
  local_438 = (char **)0xf6cf21;
  local_338._0_8_ = local_338 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_338,"foo","");
  local_358._M_dataplus._M_p = (pointer)&local_358.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_358,"default","");
  ArgsManager::GetArg((string *)local_318,&args,(string *)local_338,&local_358);
  iVar7 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_318,
                     "");
  local_410 = (UniValue **)CONCAT71(local_410._1_7_,iVar7 == 0);
  local_408 = (element_type *)0x0;
  sStack_400.pi_ = (sp_counted_base *)0x0;
  local_420 = (char **)0xe96108;
  local_418 = "";
  local_2f8._8_8_ = local_2f8._8_8_ & 0xffffffffffffff00;
  local_2f8._0_8_ = &PTR__lazy_ostream_013abbf0;
  local_2f8._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_2e0._M_local_buf[0] = (char)&local_428;
  local_2e0._1_7_ = (undefined7)((ulong)&local_428 >> 8);
  local_430 = "";
  local_58._8_8_ = local_58._8_8_ & 0xffffffffffffff00;
  local_58._0_8_ = &PTR__lazy_ostream_013ac170;
  aStack_48._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  aStack_48._8_8_ = &local_430;
  pvVar8 = (iterator)0x1;
  pvVar9 = (iterator)0x2;
  local_428 = (UniValue *)local_318;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_410,&local_450,1,2,REQUIRE,0xe961f8,(size_t)&local_420,0x62,
             local_2f8,"\"\"",local_58);
  boost::detail::shared_count::~shared_count(&sStack_400);
  if ((undefined1 *)local_318._0_8_ != local_308) {
    operator_delete((void *)local_318._0_8_,(ulong)(local_308._0_8_ + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_358._M_dataplus._M_p != &local_358.field_2) {
    operator_delete(local_358._M_dataplus._M_p,local_358.field_2._M_allocated_capacity + 1);
  }
  if ((undefined1 *)local_338._0_8_ != local_338 + 0x10) {
    operator_delete((void *)local_338._0_8_,local_338._16_8_ + 1);
  }
  local_728 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/getarg_tests.cpp"
  ;
  local_720 = "";
  local_738 = &boost::unit_test::basic_cstring<char_const>::null;
  local_730 = &boost::unit_test::basic_cstring<char_const>::null;
  file_21.m_end = (iterator)0x63;
  file_21.m_begin = (iterator)&local_728;
  msg_21.m_end = pvVar9;
  msg_21.m_begin = pvVar8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_21,(size_t)&local_738,
             msg_21);
  local_450.m_empty = false;
  local_450._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013abb30;
  local_440 = boost::unit_test::lazy_ostream::inst;
  local_438 = (char **)0xf6cf21;
  local_318._0_8_ = local_308;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_318,"foo","");
  local_428 = (UniValue *)ArgsManager::GetIntArg(&args,(string *)local_318,100);
  local_430 = (char *)((ulong)local_430 & 0xffffffff00000000);
  local_338[0] = local_428 == (UniValue *)0x0;
  local_338._8_8_ = (pointer)0x0;
  local_338._16_8_ = 0;
  local_358._M_dataplus._M_p =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/getarg_tests.cpp"
  ;
  local_358._M_string_length = 0xe9616d;
  local_410 = &local_428;
  local_2f8._8_8_ = local_2f8._8_8_ & 0xffffffffffffff00;
  local_2f8._0_8_ = &PTR__lazy_ostream_013abed0;
  local_2f8._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_2e0._M_local_buf[0] = (char)(assertion_result *)&local_410;
  uVar4 = local_2e0._M_local_buf[0];
  local_2e0._1_7_ = (undefined7)((ulong)&local_410 >> 8);
  uVar5 = local_2e0._1_7_;
  local_420 = &local_430;
  local_58._8_8_ = local_58._8_8_ & 0xffffffffffffff00;
  local_58._0_8_ = &PTR__lazy_ostream_013abcf0;
  aStack_48._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  pvVar8 = (iterator)0x1;
  pvVar9 = (iterator)0x2;
  aStack_48._8_8_ = &local_420;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_338,&local_450,1,2,REQUIRE,0xe96216,(size_t)&local_358,99,
             local_2f8,"0",local_58);
  boost::detail::shared_count::~shared_count((shared_count *)(local_338 + 0x10));
  if ((undefined1 *)local_318._0_8_ != local_308) {
    operator_delete((void *)local_318._0_8_,(ulong)(local_308._0_8_ + 1));
  }
  local_748 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/getarg_tests.cpp"
  ;
  local_740 = "";
  local_758 = &boost::unit_test::basic_cstring<char_const>::null;
  local_750 = &boost::unit_test::basic_cstring<char_const>::null;
  file_22.m_end = (iterator)0x64;
  file_22.m_begin = (iterator)&local_748;
  msg_22.m_end = pvVar9;
  msg_22.m_begin = pvVar8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_22,(size_t)&local_758,
             msg_22);
  local_450.m_empty = false;
  local_450._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013abb30;
  local_440 = boost::unit_test::lazy_ostream::inst;
  local_438 = (char **)0xf6cf21;
  local_318._0_8_ = local_308;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_318,"foo","");
  bVar6 = ArgsManager::GetBoolArg(&args,(string *)local_318,true);
  local_428 = (UniValue *)CONCAT71(local_428._1_7_,bVar6);
  local_430 = (char *)CONCAT71(local_430._1_7_,1);
  local_338[0] = bVar6;
  local_338._8_8_ = (pointer)0x0;
  local_338._16_8_ = 0;
  local_358._M_dataplus._M_p =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/getarg_tests.cpp"
  ;
  local_358._M_string_length = 0xe9616d;
  local_410 = &local_428;
  local_2f8._8_8_ = local_2f8._8_8_ & 0xffffffffffffff00;
  local_2f8._0_8_ = &PTR__lazy_ostream_013abe90;
  local_2f8._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_420 = &local_430;
  local_58._8_8_ = local_58._8_8_ & 0xffffffffffffff00;
  local_58._0_8_ = &PTR__lazy_ostream_013abe90;
  aStack_48._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  pvVar8 = (iterator)0x1;
  pvVar9 = (iterator)0x2;
  local_2e0._M_local_buf[0] = uVar4;
  local_2e0._1_7_ = uVar5;
  aStack_48._8_8_ = &local_420;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_338,&local_450,1,2,REQUIRE,0xe96231,(size_t)&local_358,100,
             local_2f8,"true",local_58);
  boost::detail::shared_count::~shared_count((shared_count *)(local_338 + 0x10));
  if ((undefined1 *)local_318._0_8_ != local_308) {
    operator_delete((void *)local_318._0_8_,(ulong)(local_308._0_8_ + 1));
  }
  local_768 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/getarg_tests.cpp"
  ;
  local_760 = "";
  local_778 = &boost::unit_test::basic_cstring<char_const>::null;
  local_770 = &boost::unit_test::basic_cstring<char_const>::null;
  file_23.m_end = (iterator)0x65;
  file_23.m_begin = (iterator)&local_768;
  msg_23.m_end = pvVar9;
  msg_23.m_begin = pvVar8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_23,(size_t)&local_778,
             msg_23);
  local_450.m_empty = false;
  local_450._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013abb30;
  local_440 = boost::unit_test::lazy_ostream::inst;
  local_438 = (char **)0xf6cf21;
  local_318._0_8_ = local_308;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_318,"foo","");
  bVar6 = ArgsManager::GetBoolArg(&args,(string *)local_318,false);
  local_428 = (UniValue *)CONCAT71(local_428._1_7_,bVar6);
  local_430 = (char *)CONCAT71(local_430._1_7_,1);
  local_338[0] = bVar6;
  local_338._8_8_ = (pointer)0x0;
  local_338._16_8_ = 0;
  local_358._M_dataplus._M_p =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/getarg_tests.cpp"
  ;
  local_358._M_string_length = 0xe9616d;
  local_410 = &local_428;
  local_2f8._8_8_ = local_2f8._8_8_ & 0xffffffffffffff00;
  local_2f8._0_8_ = &PTR__lazy_ostream_013abe90;
  local_2f8._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_420 = &local_430;
  local_58._8_8_ = local_58._8_8_ & 0xffffffffffffff00;
  local_58._0_8_ = &PTR__lazy_ostream_013abe90;
  aStack_48._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  pvVar8 = (iterator)0x1;
  pvVar9 = (iterator)0x2;
  local_2e0._M_local_buf[0] = uVar4;
  local_2e0._1_7_ = uVar5;
  aStack_48._8_8_ = &local_420;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_338,&local_450,1,2,REQUIRE,0xe9624e,(size_t)&local_358,0x65,
             local_2f8,"true",local_58);
  psVar2 = (shared_count *)(local_338 + 0x10);
  boost::detail::shared_count::~shared_count(psVar2);
  if ((undefined1 *)local_318._0_8_ != local_308) {
    operator_delete((void *)local_318._0_8_,(ulong)(local_308._0_8_ + 1));
  }
  local_58._0_4_ = 99;
  ::UniValue::UniValue<int,_int,_true>((UniValue *)local_2f8,(int *)local_58);
  test_method::anon_class_8_1_89897ddb::operator()(&set_foo,(SettingsValue *)local_2f8);
  std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&vStack_2b8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_2d0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2f8._8_8_ != &local_2e0) {
    operator_delete((void *)local_2f8._8_8_,CONCAT71(local_2e0._1_7_,local_2e0._M_local_buf[0]) + 1)
    ;
  }
  local_788 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/getarg_tests.cpp"
  ;
  local_780 = "";
  local_798 = &boost::unit_test::basic_cstring<char_const>::null;
  local_790 = &boost::unit_test::basic_cstring<char_const>::null;
  file_24.m_end = &DAT_00000068;
  file_24.m_begin = (iterator)&local_788;
  msg_24.m_end = pvVar9;
  msg_24.m_begin = pvVar8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_24,(size_t)&local_798,
             msg_24);
  local_318[8] = false;
  local_318._0_8_ = &PTR__lazy_ostream_013abb30;
  local_308._0_8_ = boost::unit_test::lazy_ostream::inst;
  local_308._8_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  local_358._M_dataplus._M_p = (pointer)&local_358.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_358,"foo","");
  ArgsManager::GetSetting((SettingsValue *)local_2f8,&args,&local_358);
  ::UniValue::write_abi_cxx11_((UniValue *)local_338,(int)local_2f8,(void *)0x0,0);
  iVar7 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_338,
                     "99");
  local_410 = (UniValue **)CONCAT71(local_410._1_7_,iVar7 == 0);
  local_408 = (element_type *)0x0;
  sStack_400.pi_ = (sp_counted_base *)0x0;
  local_420 = (char **)0xe96108;
  local_418 = "";
  local_58._8_8_ = local_58._8_8_ & 0xffffffffffffff00;
  local_58._0_8_ = &PTR__lazy_ostream_013abbf0;
  aStack_48._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  aStack_48._8_8_ = &local_428;
  local_430 = "99";
  local_450.m_empty = false;
  local_450._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ad300;
  local_440 = boost::unit_test::lazy_ostream::inst;
  local_438 = &local_430;
  pvVar8 = (iterator)0x1;
  pvVar9 = (iterator)0x2;
  local_428 = (UniValue *)local_338;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_410,(lazy_ostream *)local_318,1,2,REQUIRE,0xe961c9,
             (size_t)&local_420,0x68,local_58,"\"99\"",&local_450);
  boost::detail::shared_count::~shared_count(&sStack_400);
  if ((shared_count *)local_338._0_8_ != psVar2) {
    operator_delete((void *)local_338._0_8_,local_338._16_8_ + 1);
  }
  std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&vStack_2b8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_2d0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2f8._8_8_ != &local_2e0) {
    operator_delete((void *)local_2f8._8_8_,CONCAT71(local_2e0._1_7_,local_2e0._M_local_buf[0]) + 1)
    ;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_358._M_dataplus._M_p != &local_358.field_2) {
    operator_delete(local_358._M_dataplus._M_p,local_358.field_2._M_allocated_capacity + 1);
  }
  local_7a8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/getarg_tests.cpp"
  ;
  local_7a0 = "";
  local_7b8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_7b0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_25.m_end = (iterator)0x69;
  file_25.m_begin = (iterator)&local_7a8;
  msg_25.m_end = pvVar9;
  msg_25.m_begin = pvVar8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_25,(size_t)&local_7b8,
             msg_25);
  local_450.m_empty = false;
  local_450._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013abb30;
  local_440 = boost::unit_test::lazy_ostream::inst;
  local_438 = (char **)0xf6cf21;
  local_338._0_8_ = psVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_338,"foo","");
  local_358._M_dataplus._M_p = (pointer)&local_358.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_358,"default","");
  ArgsManager::GetArg((string *)local_318,&args,(string *)local_338,&local_358);
  iVar7 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_318,
                     "99");
  local_410 = (UniValue **)CONCAT71(local_410._1_7_,iVar7 == 0);
  local_408 = (element_type *)0x0;
  sStack_400.pi_ = (sp_counted_base *)0x0;
  local_420 = (char **)0xe96108;
  local_418 = "";
  local_2f8._8_8_ = local_2f8._8_8_ & 0xffffffffffffff00;
  local_2f8._0_8_ = &PTR__lazy_ostream_013abbf0;
  local_2f8._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_2e0._M_local_buf[0] = (char)&local_428;
  local_2e0._1_7_ = (undefined7)((ulong)&local_428 >> 8);
  local_430 = "99";
  local_58._8_8_ = local_58._8_8_ & 0xffffffffffffff00;
  local_58._0_8_ = &PTR__lazy_ostream_013ad300;
  aStack_48._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  aStack_48._8_8_ = &local_430;
  pvVar8 = (iterator)0x1;
  pvVar9 = (iterator)0x2;
  local_428 = (UniValue *)local_318;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_410,&local_450,1,2,REQUIRE,0xe961f8,(size_t)&local_420,0x69,
             local_2f8,"\"99\"",local_58);
  boost::detail::shared_count::~shared_count(&sStack_400);
  if ((undefined1 *)local_318._0_8_ != local_308) {
    operator_delete((void *)local_318._0_8_,(ulong)(local_308._0_8_ + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_358._M_dataplus._M_p != &local_358.field_2) {
    operator_delete(local_358._M_dataplus._M_p,local_358.field_2._M_allocated_capacity + 1);
  }
  if ((shared_count *)local_338._0_8_ != psVar2) {
    operator_delete((void *)local_338._0_8_,local_338._16_8_ + 1);
  }
  local_7c8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/getarg_tests.cpp"
  ;
  local_7c0 = "";
  local_7d8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_7d0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_26.m_end = (iterator)0x6a;
  file_26.m_begin = (iterator)&local_7c8;
  msg_26.m_end = pvVar9;
  msg_26.m_begin = pvVar8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_26,(size_t)&local_7d8,
             msg_26);
  local_450.m_empty = false;
  local_450._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013abb30;
  local_440 = boost::unit_test::lazy_ostream::inst;
  local_438 = (char **)0xf6cf21;
  local_318._0_8_ = local_308;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_318,"foo","");
  local_428 = (UniValue *)ArgsManager::GetIntArg(&args,(string *)local_318,100);
  local_430 = (char *)CONCAT44(local_430._4_4_,99);
  local_338[0] = local_428 == (UniValue *)0x63;
  local_338._8_8_ = (pointer)0x0;
  local_338._16_8_ = 0;
  local_358._M_dataplus._M_p =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/getarg_tests.cpp"
  ;
  local_358._M_string_length = 0xe9616d;
  local_410 = &local_428;
  local_2f8._8_8_ = local_2f8._8_8_ & 0xffffffffffffff00;
  local_2f8._0_8_ = &PTR__lazy_ostream_013abed0;
  local_2f8._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_2e0._M_local_buf[0] = (char)(assertion_result *)&local_410;
  local_2e0._1_7_ = (undefined7)((ulong)&local_410 >> 8);
  local_420 = &local_430;
  local_58._8_8_ = local_58._8_8_ & 0xffffffffffffff00;
  local_58._0_8_ = &PTR__lazy_ostream_013abcf0;
  aStack_48._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  pvVar8 = (iterator)0x1;
  pvVar9 = (iterator)0x2;
  aStack_48._8_8_ = &local_420;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_338,&local_450,1,2,REQUIRE,0xe96216,(size_t)&local_358,0x6a,
             local_2f8,"99",local_58);
  boost::detail::shared_count::~shared_count((shared_count *)(local_338 + 0x10));
  if ((undefined1 *)local_318._0_8_ != local_308) {
    operator_delete((void *)local_318._0_8_,(ulong)(local_308._0_8_ + 1));
  }
  local_7e8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/getarg_tests.cpp"
  ;
  local_7e0 = "";
  local_7f8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_7f0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_27.m_end = (iterator)0x6b;
  file_27.m_begin = (iterator)&local_7e8;
  msg_27.m_end = pvVar9;
  msg_27.m_begin = pvVar8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_27,(size_t)&local_7f8,
             msg_27);
  local_2f8._0_8_ = local_2f8 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2f8,"foo","");
  ArgsManager::GetBoolArg(&args,(string *)local_2f8,true);
  if ((undefined1 *)local_2f8._0_8_ != local_2f8 + 0x10) {
    operator_delete((void *)local_2f8._0_8_,(ulong)(local_2f8._16_8_ + 1));
  }
  local_808 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/getarg_tests.cpp"
  ;
  local_800 = "";
  local_818 = &boost::unit_test::basic_cstring<char_const>::null;
  local_810 = &boost::unit_test::basic_cstring<char_const>::null;
  _cVar10 = 0x3de783;
  file_28.m_end = (iterator)0x6b;
  file_28.m_begin = (iterator)&local_808;
  msg_28.m_end = pvVar9;
  msg_28.m_begin = pvVar8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_28,(size_t)&local_818,
             msg_28);
  local_58._0_8_ = local_58._0_8_ & 0xffffffffffffff00;
  local_58._8_8_ = (element_type *)0x0;
  aStack_48._M_allocated_capacity = 0;
  local_2f8._8_8_ = local_2f8._8_8_ & 0xffffffffffffff00;
  local_2f8._0_8_ = &PTR__lazy_ostream_013ac470;
  local_2f8._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_2e0._M_local_buf[0] = -0x3e;
  local_2e0._1_7_ = 0xe581;
  local_828 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/getarg_tests.cpp"
  ;
  local_820 = "";
  pvVar8 = (iterator)0x1;
  pvVar9 = (iterator)0x1;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_58,(lazy_ostream *)local_2f8,1,1,WARN,_cVar10,
             (size_t)&local_828,0x6b);
  boost::detail::shared_count::~shared_count((shared_count *)&aStack_48._M_allocated_capacity);
  local_868 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/getarg_tests.cpp"
  ;
  local_860 = "";
  local_878 = &boost::unit_test::basic_cstring<char_const>::null;
  local_870 = &boost::unit_test::basic_cstring<char_const>::null;
  file_29.m_end = (iterator)0x6c;
  file_29.m_begin = (iterator)&local_868;
  msg_29.m_end = pvVar9;
  msg_29.m_begin = pvVar8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_29,(size_t)&local_878,
             msg_29);
  local_2f8._0_8_ = local_2f8 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2f8,"foo","");
  ArgsManager::GetBoolArg(&args,(string *)local_2f8,false);
  if ((undefined1 *)local_2f8._0_8_ != local_2f8 + 0x10) {
    operator_delete((void *)local_2f8._0_8_,(ulong)(local_2f8._16_8_ + 1));
  }
  local_888 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/getarg_tests.cpp"
  ;
  local_880 = "";
  local_898 = &boost::unit_test::basic_cstring<char_const>::null;
  local_890 = &boost::unit_test::basic_cstring<char_const>::null;
  _cVar10 = 0x3de8cd;
  file_30.m_end = (iterator)0x6c;
  file_30.m_begin = (iterator)&local_888;
  msg_30.m_end = pvVar9;
  msg_30.m_begin = pvVar8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_30,(size_t)&local_898,
             msg_30);
  local_58._0_8_ = local_58._0_8_ & 0xffffffffffffff00;
  local_58._8_8_ = (element_type *)0x0;
  aStack_48._M_allocated_capacity = 0;
  local_2f8._8_8_ = local_2f8._8_8_ & 0xffffffffffffff00;
  local_2f8._0_8_ = &PTR__lazy_ostream_013ac470;
  local_2f8._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_2e0._M_local_buf[0] = -0x3e;
  local_2e0._1_7_ = 0xe581;
  local_8a8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/getarg_tests.cpp"
  ;
  local_8a0 = "";
  pvVar8 = (iterator)0x1;
  pvVar9 = (iterator)0x1;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_58,(lazy_ostream *)local_2f8,1,1,WARN,_cVar10,
             (size_t)&local_8a8,0x6c);
  boost::detail::shared_count::~shared_count((shared_count *)&aStack_48._M_allocated_capacity);
  local_58._0_8_ = (pointer)0x400a000000000000;
  ::UniValue::UniValue<double,_double,_true>((UniValue *)local_2f8,(double *)local_58);
  test_method::anon_class_8_1_89897ddb::operator()(&set_foo,(SettingsValue *)local_2f8);
  std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&vStack_2b8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_2d0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2f8._8_8_ != &local_2e0) {
    operator_delete((void *)local_2f8._8_8_,CONCAT71(local_2e0._1_7_,local_2e0._M_local_buf[0]) + 1)
    ;
  }
  local_8e8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/getarg_tests.cpp"
  ;
  local_8e0 = "";
  local_8f8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_8f0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_31.m_end = (iterator)0x6f;
  file_31.m_begin = (iterator)&local_8e8;
  msg_31.m_end = pvVar9;
  msg_31.m_begin = pvVar8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_31,(size_t)&local_8f8,
             msg_31);
  local_318[8] = false;
  local_318._0_8_ = &PTR__lazy_ostream_013abb30;
  local_308._0_8_ = boost::unit_test::lazy_ostream::inst;
  local_308._8_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  local_358._M_dataplus._M_p = (pointer)&local_358.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_358,"foo","");
  ArgsManager::GetSetting((SettingsValue *)local_2f8,&args,&local_358);
  ::UniValue::write_abi_cxx11_((UniValue *)local_338,(int)local_2f8,(void *)0x0,0);
  iVar7 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_338,
                     "3.25");
  local_410 = (UniValue **)CONCAT71(local_410._1_7_,iVar7 == 0);
  local_408 = (element_type *)0x0;
  sStack_400.pi_ = (sp_counted_base *)0x0;
  local_420 = (char **)0xe96108;
  local_418 = "";
  local_58._8_8_ = local_58._8_8_ & 0xffffffffffffff00;
  local_58._0_8_ = &PTR__lazy_ostream_013abbf0;
  aStack_48._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  aStack_48._8_8_ = &local_428;
  local_430 = "3.25";
  local_450.m_empty = false;
  local_450._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ac430;
  local_440 = boost::unit_test::lazy_ostream::inst;
  local_438 = &local_430;
  pvVar8 = (iterator)0x1;
  pvVar9 = (iterator)0x2;
  local_428 = (UniValue *)local_338;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_410,(lazy_ostream *)local_318,1,2,REQUIRE,0xe961c9,
             (size_t)&local_420,0x6f,local_58,"\"3.25\"",&local_450);
  boost::detail::shared_count::~shared_count(&sStack_400);
  if ((undefined1 *)local_338._0_8_ != local_338 + 0x10) {
    operator_delete((void *)local_338._0_8_,local_338._16_8_ + 1);
  }
  std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&vStack_2b8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_2d0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2f8._8_8_ != &local_2e0) {
    operator_delete((void *)local_2f8._8_8_,CONCAT71(local_2e0._1_7_,local_2e0._M_local_buf[0]) + 1)
    ;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_358._M_dataplus._M_p != &local_358.field_2) {
    operator_delete(local_358._M_dataplus._M_p,local_358.field_2._M_allocated_capacity + 1);
  }
  local_908 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/getarg_tests.cpp"
  ;
  local_900 = "";
  local_918 = &boost::unit_test::basic_cstring<char_const>::null;
  local_910 = &boost::unit_test::basic_cstring<char_const>::null;
  file_32.m_end = (iterator)0x70;
  file_32.m_begin = (iterator)&local_908;
  msg_32.m_end = pvVar9;
  msg_32.m_begin = pvVar8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_32,(size_t)&local_918,
             msg_32);
  local_450.m_empty = false;
  local_450._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013abb30;
  local_440 = boost::unit_test::lazy_ostream::inst;
  local_438 = (char **)0xf6cf21;
  local_338._0_8_ = local_338 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_338,"foo","");
  local_358._M_dataplus._M_p = (pointer)&local_358.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_358,"default","");
  ArgsManager::GetArg((string *)local_318,&args,(string *)local_338,&local_358);
  pcVar1 = local_2f8 + 0x10;
  iVar7 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_318,
                     "3.25");
  local_410 = (UniValue **)CONCAT71(local_410._1_7_,iVar7 == 0);
  local_408 = (element_type *)0x0;
  sStack_400.pi_ = (sp_counted_base *)0x0;
  local_420 = (char **)0xe96108;
  local_418 = "";
  local_2f8._8_8_ = local_2f8._8_8_ & 0xffffffffffffff00;
  local_2f8._0_8_ = &PTR__lazy_ostream_013abbf0;
  local_2f8._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_2e0._M_local_buf[0] = (char)&local_428;
  local_2e0._1_7_ = (undefined7)((ulong)&local_428 >> 8);
  local_430 = "3.25";
  local_58._8_8_ = local_58._8_8_ & 0xffffffffffffff00;
  local_58._0_8_ = &PTR__lazy_ostream_013ac430;
  aStack_48._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  aStack_48._8_8_ = &local_430;
  pvVar8 = (iterator)0x1;
  pvVar9 = (iterator)0x2;
  local_428 = (UniValue *)local_318;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_410,&local_450,1,2,REQUIRE,0xe961f8,(size_t)&local_420,0x70,
             local_2f8,"\"3.25\"",local_58);
  boost::detail::shared_count::~shared_count(&sStack_400);
  pcVar3 = local_338 + 0x10;
  if ((undefined1 *)local_318._0_8_ != local_308) {
    operator_delete((void *)local_318._0_8_,(ulong)(local_308._0_8_ + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_358._M_dataplus._M_p != &local_358.field_2) {
    operator_delete(local_358._M_dataplus._M_p,local_358.field_2._M_allocated_capacity + 1);
  }
  if ((pointer)local_338._0_8_ != pcVar3) {
    operator_delete((void *)local_338._0_8_,local_338._16_8_ + 1);
  }
  local_928 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/getarg_tests.cpp"
  ;
  local_920 = "";
  local_938 = &boost::unit_test::basic_cstring<char_const>::null;
  local_930 = &boost::unit_test::basic_cstring<char_const>::null;
  file_33.m_end = (iterator)0x71;
  file_33.m_begin = (iterator)&local_928;
  msg_33.m_end = pvVar9;
  msg_33.m_begin = pvVar8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_33,(size_t)&local_938,
             msg_33);
  local_2f8._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2f8,"foo","");
  ArgsManager::GetIntArg(&args,(string *)local_2f8,100);
  if ((pointer)local_2f8._0_8_ != pcVar1) {
    operator_delete((void *)local_2f8._0_8_,(ulong)(local_2f8._16_8_ + 1));
  }
  local_948 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/getarg_tests.cpp"
  ;
  local_940 = "";
  local_958 = &boost::unit_test::basic_cstring<char_const>::null;
  local_950 = &boost::unit_test::basic_cstring<char_const>::null;
  _cVar10 = 0x3def59;
  file_34.m_end = (iterator)0x71;
  file_34.m_begin = (iterator)&local_948;
  msg_34.m_end = pvVar9;
  msg_34.m_begin = pvVar8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_34,(size_t)&local_958,
             msg_34);
  local_58._0_8_ = local_58._0_8_ & 0xffffffffffffff00;
  local_58._8_8_ = (element_type *)0x0;
  aStack_48._M_allocated_capacity = 0;
  local_2f8._8_8_ = local_2f8._8_8_ & 0xffffffffffffff00;
  local_2f8._0_8_ = &PTR__lazy_ostream_013ac470;
  local_2f8._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_2e0._M_local_buf[0] = -0x3e;
  local_2e0._1_7_ = 0xe581;
  local_968 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/getarg_tests.cpp"
  ;
  local_960 = "";
  pvVar8 = (iterator)0x1;
  pvVar9 = (iterator)0x1;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_58,(lazy_ostream *)local_2f8,1,1,WARN,_cVar10,
             (size_t)&local_968,0x71);
  boost::detail::shared_count::~shared_count((shared_count *)&aStack_48._M_allocated_capacity);
  local_9a8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/getarg_tests.cpp"
  ;
  local_9a0 = "";
  local_9b8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_9b0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_35.m_end = (iterator)0x72;
  file_35.m_begin = (iterator)&local_9a8;
  msg_35.m_end = pvVar9;
  msg_35.m_begin = pvVar8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_35,(size_t)&local_9b8,
             msg_35);
  local_2f8._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2f8,"foo","");
  ArgsManager::GetBoolArg(&args,(string *)local_2f8,true);
  if ((pointer)local_2f8._0_8_ != pcVar1) {
    operator_delete((void *)local_2f8._0_8_,(ulong)(local_2f8._16_8_ + 1));
  }
  local_9c8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/getarg_tests.cpp"
  ;
  local_9c0 = "";
  local_9d8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_9d0 = &boost::unit_test::basic_cstring<char_const>::null;
  _cVar10 = 0x3df0a4;
  file_36.m_end = (iterator)0x72;
  file_36.m_begin = (iterator)&local_9c8;
  msg_36.m_end = pvVar9;
  msg_36.m_begin = pvVar8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_36,(size_t)&local_9d8,
             msg_36);
  local_58._0_8_ = local_58._0_8_ & 0xffffffffffffff00;
  local_58._8_8_ = (element_type *)0x0;
  aStack_48._M_allocated_capacity = 0;
  local_2f8._8_8_ = local_2f8._8_8_ & 0xffffffffffffff00;
  local_2f8._0_8_ = &PTR__lazy_ostream_013ac470;
  local_2f8._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_2e0._M_local_buf[0] = -0x3e;
  local_2e0._1_7_ = 0xe581;
  local_9e8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/getarg_tests.cpp"
  ;
  local_9e0 = "";
  pvVar8 = (iterator)0x1;
  pvVar9 = (iterator)0x1;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_58,(lazy_ostream *)local_2f8,1,1,WARN,_cVar10,
             (size_t)&local_9e8,0x72);
  boost::detail::shared_count::~shared_count((shared_count *)&aStack_48._M_allocated_capacity);
  local_a28 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/getarg_tests.cpp"
  ;
  local_a20 = "";
  local_a38 = &boost::unit_test::basic_cstring<char_const>::null;
  local_a30 = &boost::unit_test::basic_cstring<char_const>::null;
  file_37.m_end = (iterator)0x73;
  file_37.m_begin = (iterator)&local_a28;
  msg_37.m_end = pvVar9;
  msg_37.m_begin = pvVar8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_37,(size_t)&local_a38,
             msg_37);
  local_2f8._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2f8,"foo","");
  ArgsManager::GetBoolArg(&args,(string *)local_2f8,false);
  if ((pointer)local_2f8._0_8_ != pcVar1) {
    operator_delete((void *)local_2f8._0_8_,(ulong)(local_2f8._16_8_ + 1));
  }
  local_a48 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/getarg_tests.cpp"
  ;
  local_a40 = "";
  local_a58 = &boost::unit_test::basic_cstring<char_const>::null;
  local_a50 = &boost::unit_test::basic_cstring<char_const>::null;
  _cVar10 = 0x3df1ec;
  file_38.m_end = (iterator)0x73;
  file_38.m_begin = (iterator)&local_a48;
  msg_38.m_end = pvVar9;
  msg_38.m_begin = pvVar8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_38,(size_t)&local_a58,
             msg_38);
  local_58._0_8_ = local_58._0_8_ & 0xffffffffffffff00;
  local_58._8_8_ = (element_type *)0x0;
  aStack_48._M_allocated_capacity = 0;
  local_2f8._8_8_ = local_2f8._8_8_ & 0xffffffffffffff00;
  local_2f8._0_8_ = &PTR__lazy_ostream_013ac470;
  local_2f8._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_2e0._M_local_buf[0] = -0x3e;
  local_2e0._1_7_ = 0xe581;
  local_a68 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/getarg_tests.cpp"
  ;
  local_a60 = "";
  pvVar8 = (iterator)0x1;
  pvVar9 = (iterator)0x1;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_58,(lazy_ostream *)local_2f8,1,1,WARN,_cVar10,
             (size_t)&local_a68,0x73);
  boost::detail::shared_count::~shared_count((shared_count *)&aStack_48._M_allocated_capacity);
  local_58._0_8_ = local_58._0_8_ & 0xffffffff00000000;
  ::UniValue::UniValue<int,_int,_true>((UniValue *)local_2f8,(int *)local_58);
  test_method::anon_class_8_1_89897ddb::operator()(&set_foo,(SettingsValue *)local_2f8);
  std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&vStack_2b8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_2d0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2f8._8_8_ != &local_2e0) {
    operator_delete((void *)local_2f8._8_8_,CONCAT71(local_2e0._1_7_,local_2e0._M_local_buf[0]) + 1)
    ;
  }
  local_aa8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/getarg_tests.cpp"
  ;
  local_aa0 = "";
  local_ab8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_ab0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_39.m_end = (iterator)0x76;
  file_39.m_begin = (iterator)&local_aa8;
  msg_39.m_end = pvVar9;
  msg_39.m_begin = pvVar8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_39,(size_t)&local_ab8,
             msg_39);
  local_318[8] = false;
  local_318._0_8_ = &PTR__lazy_ostream_013abb30;
  local_308._0_8_ = boost::unit_test::lazy_ostream::inst;
  local_308._8_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  local_358._M_dataplus._M_p = (pointer)&local_358.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_358,"foo","");
  ArgsManager::GetSetting((SettingsValue *)local_2f8,&args,&local_358);
  ::UniValue::write_abi_cxx11_((UniValue *)local_338,(int)local_2f8,(void *)0x0,0);
  iVar7 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_338,
                     "0");
  local_410 = (UniValue **)CONCAT71(local_410._1_7_,iVar7 == 0);
  local_408 = (element_type *)0x0;
  sStack_400.pi_ = (sp_counted_base *)0x0;
  local_420 = (char **)0xe96108;
  local_418 = "";
  local_58._8_8_ = local_58._8_8_ & 0xffffffffffffff00;
  local_58._0_8_ = &PTR__lazy_ostream_013abbf0;
  aStack_48._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  aStack_48._8_8_ = &local_428;
  local_430 = "0";
  local_450.m_empty = false;
  local_450._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ac2b0;
  local_440 = boost::unit_test::lazy_ostream::inst;
  local_438 = &local_430;
  pvVar8 = (iterator)0x1;
  pvVar9 = (iterator)0x2;
  local_428 = (UniValue *)local_338;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_410,(lazy_ostream *)local_318,1,2,REQUIRE,0xe961c9,
             (size_t)&local_420,0x76,local_58,"\"0\"",&local_450);
  boost::detail::shared_count::~shared_count(&sStack_400);
  if ((pointer)local_338._0_8_ != pcVar3) {
    operator_delete((void *)local_338._0_8_,local_338._16_8_ + 1);
  }
  std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&vStack_2b8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_2d0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2f8._8_8_ != &local_2e0) {
    operator_delete((void *)local_2f8._8_8_,CONCAT71(local_2e0._1_7_,local_2e0._M_local_buf[0]) + 1)
    ;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_358._M_dataplus._M_p != &local_358.field_2) {
    operator_delete(local_358._M_dataplus._M_p,local_358.field_2._M_allocated_capacity + 1);
  }
  local_ac8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/getarg_tests.cpp"
  ;
  local_ac0 = "";
  local_ad8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_ad0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_40.m_end = (iterator)0x77;
  file_40.m_begin = (iterator)&local_ac8;
  msg_40.m_end = pvVar9;
  msg_40.m_begin = pvVar8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_40,(size_t)&local_ad8,
             msg_40);
  local_450.m_empty = false;
  local_450._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013abb30;
  local_440 = boost::unit_test::lazy_ostream::inst;
  local_438 = (char **)0xf6cf21;
  local_338._0_8_ = pcVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_338,"foo","");
  local_358._M_dataplus._M_p = (pointer)&local_358.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_358,"default","");
  ArgsManager::GetArg((string *)local_318,&args,(string *)local_338,&local_358);
  iVar7 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_318,
                     "0");
  local_410 = (UniValue **)CONCAT71(local_410._1_7_,iVar7 == 0);
  local_408 = (element_type *)0x0;
  sStack_400.pi_ = (sp_counted_base *)0x0;
  local_420 = (char **)0xe96108;
  local_418 = "";
  local_2f8._8_8_ = local_2f8._8_8_ & 0xffffffffffffff00;
  local_2f8._0_8_ = &PTR__lazy_ostream_013abbf0;
  local_2f8._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_2e0._M_local_buf[0] = (char)&local_428;
  local_2e0._1_7_ = (undefined7)((ulong)&local_428 >> 8);
  local_430 = "0";
  local_58._8_8_ = local_58._8_8_ & 0xffffffffffffff00;
  local_58._0_8_ = &PTR__lazy_ostream_013ac2b0;
  aStack_48._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  aStack_48._8_8_ = &local_430;
  pvVar8 = (iterator)0x1;
  pvVar9 = (iterator)0x2;
  local_428 = (UniValue *)local_318;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_410,&local_450,1,2,REQUIRE,0xe961f8,(size_t)&local_420,0x77,
             local_2f8,"\"0\"",local_58);
  boost::detail::shared_count::~shared_count(&sStack_400);
  if ((undefined1 *)local_318._0_8_ != local_308) {
    operator_delete((void *)local_318._0_8_,(ulong)(local_308._0_8_ + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_358._M_dataplus._M_p != &local_358.field_2) {
    operator_delete(local_358._M_dataplus._M_p,local_358.field_2._M_allocated_capacity + 1);
  }
  if ((undefined1 *)local_338._0_8_ != local_338 + 0x10) {
    operator_delete((void *)local_338._0_8_,local_338._16_8_ + 1);
  }
  local_ae8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/getarg_tests.cpp"
  ;
  local_ae0 = "";
  local_af8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_af0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_41.m_end = (iterator)0x78;
  file_41.m_begin = (iterator)&local_ae8;
  msg_41.m_end = pvVar9;
  msg_41.m_begin = pvVar8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_41,(size_t)&local_af8,
             msg_41);
  local_450.m_empty = false;
  local_450._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013abb30;
  local_440 = boost::unit_test::lazy_ostream::inst;
  local_438 = (char **)0xf6cf21;
  local_318._0_8_ = local_308;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_318,"foo","");
  local_428 = (UniValue *)ArgsManager::GetIntArg(&args,(string *)local_318,100);
  local_430 = (char *)((ulong)local_430 & 0xffffffff00000000);
  local_338[0] = local_428 == (UniValue *)0x0;
  local_338._8_8_ = (pointer)0x0;
  local_338._16_8_ = 0;
  local_358._M_dataplus._M_p =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/getarg_tests.cpp"
  ;
  local_358._M_string_length = 0xe9616d;
  local_410 = &local_428;
  local_2f8._8_8_ = local_2f8._8_8_ & 0xffffffffffffff00;
  local_2f8._0_8_ = &PTR__lazy_ostream_013abed0;
  local_2f8._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_2e0._M_local_buf[0] = (char)(assertion_result *)&local_410;
  local_2e0._1_7_ = (undefined7)((ulong)&local_410 >> 8);
  local_420 = &local_430;
  local_58._8_8_ = local_58._8_8_ & 0xffffffffffffff00;
  local_58._0_8_ = &PTR__lazy_ostream_013abcf0;
  aStack_48._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  pvVar8 = (iterator)0x1;
  pvVar9 = (iterator)0x2;
  aStack_48._8_8_ = &local_420;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_338,&local_450,1,2,REQUIRE,0xe96216,(size_t)&local_358,0x78,
             local_2f8,"0",local_58);
  boost::detail::shared_count::~shared_count((shared_count *)(local_338 + 0x10));
  pcVar1 = local_2f8 + 0x10;
  if ((undefined1 *)local_318._0_8_ != local_308) {
    operator_delete((void *)local_318._0_8_,(ulong)(local_308._0_8_ + 1));
  }
  local_b08 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/getarg_tests.cpp"
  ;
  local_b00 = "";
  local_b18 = &boost::unit_test::basic_cstring<char_const>::null;
  local_b10 = &boost::unit_test::basic_cstring<char_const>::null;
  file_42.m_end = (iterator)0x79;
  file_42.m_begin = (iterator)&local_b08;
  msg_42.m_end = pvVar9;
  msg_42.m_begin = pvVar8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_42,(size_t)&local_b18,
             msg_42);
  local_2f8._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2f8,"foo","");
  ArgsManager::GetBoolArg(&args,(string *)local_2f8,true);
  if ((pointer)local_2f8._0_8_ != pcVar1) {
    operator_delete((void *)local_2f8._0_8_,(ulong)(local_2f8._16_8_ + 1));
  }
  local_b28 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/getarg_tests.cpp"
  ;
  local_b20 = "";
  local_b38 = &boost::unit_test::basic_cstring<char_const>::null;
  local_b30 = &boost::unit_test::basic_cstring<char_const>::null;
  _cVar10 = 0x3dfa60;
  file_43.m_end = (iterator)0x79;
  file_43.m_begin = (iterator)&local_b28;
  msg_43.m_end = pvVar9;
  msg_43.m_begin = pvVar8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_43,(size_t)&local_b38,
             msg_43);
  local_58._0_8_ = local_58._0_8_ & 0xffffffffffffff00;
  local_58._8_8_ = (element_type *)0x0;
  aStack_48._M_allocated_capacity = 0;
  local_2f8._8_8_ = local_2f8._8_8_ & 0xffffffffffffff00;
  local_2f8._0_8_ = &PTR__lazy_ostream_013ac470;
  local_2f8._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_2e0._M_local_buf[0] = -0x3e;
  local_2e0._1_7_ = 0xe581;
  local_b48 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/getarg_tests.cpp"
  ;
  local_b40 = "";
  pvVar8 = (iterator)0x1;
  pvVar9 = (iterator)0x1;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_58,(lazy_ostream *)local_2f8,1,1,WARN,_cVar10,
             (size_t)&local_b48,0x79);
  boost::detail::shared_count::~shared_count((shared_count *)&aStack_48._M_allocated_capacity);
  local_b88 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/getarg_tests.cpp"
  ;
  local_b80 = "";
  local_b98 = &boost::unit_test::basic_cstring<char_const>::null;
  local_b90 = &boost::unit_test::basic_cstring<char_const>::null;
  file_44.m_end = (iterator)0x7a;
  file_44.m_begin = (iterator)&local_b88;
  msg_44.m_end = pvVar9;
  msg_44.m_begin = pvVar8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_44,(size_t)&local_b98,
             msg_44);
  local_2f8._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2f8,"foo","");
  ArgsManager::GetBoolArg(&args,(string *)local_2f8,false);
  if ((pointer)local_2f8._0_8_ != pcVar1) {
    operator_delete((void *)local_2f8._0_8_,(ulong)(local_2f8._16_8_ + 1));
  }
  local_ba8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/getarg_tests.cpp"
  ;
  local_ba0 = "";
  local_bb8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_bb0 = &boost::unit_test::basic_cstring<char_const>::null;
  _cVar10 = 0x3dfba8;
  file_45.m_end = (iterator)0x7a;
  file_45.m_begin = (iterator)&local_ba8;
  msg_45.m_end = pvVar9;
  msg_45.m_begin = pvVar8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_45,(size_t)&local_bb8,
             msg_45);
  local_58._0_8_ = local_58._0_8_ & 0xffffffffffffff00;
  local_58._8_8_ = (element_type *)0x0;
  aStack_48._M_allocated_capacity = 0;
  local_2f8._8_8_ = local_2f8._8_8_ & 0xffffffffffffff00;
  local_2f8._0_8_ = &PTR__lazy_ostream_013ac470;
  local_2f8._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_2e0._M_local_buf[0] = -0x3e;
  local_2e0._1_7_ = 0xe581;
  local_bc8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/getarg_tests.cpp"
  ;
  local_bc0 = "";
  pvVar8 = (iterator)0x1;
  pvVar9 = (iterator)0x1;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_58,(lazy_ostream *)local_2f8,1,1,WARN,_cVar10,
             (size_t)&local_bc8,0x7a);
  boost::detail::shared_count::~shared_count((shared_count *)&aStack_48._M_allocated_capacity);
  local_58[0] = 1;
  ::UniValue::UniValue<bool,_bool,_true>((UniValue *)local_2f8,(bool *)local_58);
  test_method::anon_class_8_1_89897ddb::operator()(&set_foo,(SettingsValue *)local_2f8);
  std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&vStack_2b8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_2d0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2f8._8_8_ != &local_2e0) {
    operator_delete((void *)local_2f8._8_8_,CONCAT71(local_2e0._1_7_,local_2e0._M_local_buf[0]) + 1)
    ;
  }
  local_c08 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/getarg_tests.cpp"
  ;
  local_c00 = "";
  local_c18 = &boost::unit_test::basic_cstring<char_const>::null;
  local_c10 = &boost::unit_test::basic_cstring<char_const>::null;
  file_46.m_end = (iterator)0x7d;
  file_46.m_begin = (iterator)&local_c08;
  msg_46.m_end = pvVar9;
  msg_46.m_begin = pvVar8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_46,(size_t)&local_c18,
             msg_46);
  local_318[8] = false;
  local_318._0_8_ = &PTR__lazy_ostream_013abb30;
  local_308._0_8_ = boost::unit_test::lazy_ostream::inst;
  local_308._8_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  local_358._M_dataplus._M_p = (pointer)&local_358.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_358,"foo","");
  ArgsManager::GetSetting((SettingsValue *)local_2f8,&args,&local_358);
  ::UniValue::write_abi_cxx11_((UniValue *)local_338,(int)local_2f8,(void *)0x0,0);
  iVar7 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_338,
                     "true");
  local_410 = (UniValue **)CONCAT71(local_410._1_7_,iVar7 == 0);
  local_408 = (element_type *)0x0;
  sStack_400.pi_ = (sp_counted_base *)0x0;
  local_420 = (char **)0xe96108;
  local_418 = "";
  local_58._8_8_ = local_58._8_8_ & 0xffffffffffffff00;
  local_58._0_8_ = &PTR__lazy_ostream_013abbf0;
  aStack_48._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  aStack_48._8_8_ = &local_428;
  local_430 = "true";
  local_450.m_empty = false;
  local_450._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ac430;
  local_440 = boost::unit_test::lazy_ostream::inst;
  local_438 = &local_430;
  pvVar8 = (iterator)0x1;
  pvVar9 = (iterator)0x2;
  local_428 = (UniValue *)local_338;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_410,(lazy_ostream *)local_318,1,2,REQUIRE,0xe961c9,
             (size_t)&local_420,0x7d,local_58,"\"true\"",&local_450);
  boost::detail::shared_count::~shared_count(&sStack_400);
  if ((undefined1 *)local_338._0_8_ != local_338 + 0x10) {
    operator_delete((void *)local_338._0_8_,local_338._16_8_ + 1);
  }
  std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&vStack_2b8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_2d0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2f8._8_8_ != &local_2e0) {
    operator_delete((void *)local_2f8._8_8_,CONCAT71(local_2e0._1_7_,local_2e0._M_local_buf[0]) + 1)
    ;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_358._M_dataplus._M_p != &local_358.field_2) {
    operator_delete(local_358._M_dataplus._M_p,local_358.field_2._M_allocated_capacity + 1);
  }
  local_c28 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/getarg_tests.cpp"
  ;
  local_c20 = "";
  local_c38 = &boost::unit_test::basic_cstring<char_const>::null;
  local_c30 = &boost::unit_test::basic_cstring<char_const>::null;
  file_47.m_end = (iterator)0x7e;
  file_47.m_begin = (iterator)&local_c28;
  msg_47.m_end = pvVar9;
  msg_47.m_begin = pvVar8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_47,(size_t)&local_c38,
             msg_47);
  local_450.m_empty = false;
  local_450._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013abb30;
  local_440 = boost::unit_test::lazy_ostream::inst;
  local_438 = (char **)0xf6cf21;
  local_338._0_8_ = local_338 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_338,"foo","");
  local_358._M_dataplus._M_p = (pointer)&local_358.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_358,"default","");
  ArgsManager::GetArg((string *)local_318,&args,(string *)local_338,&local_358);
  iVar7 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_318,
                     "1");
  local_410 = (UniValue **)CONCAT71(local_410._1_7_,iVar7 == 0);
  local_408 = (element_type *)0x0;
  sStack_400.pi_ = (sp_counted_base *)0x0;
  local_420 = (char **)0xe96108;
  local_418 = "";
  local_2f8._8_8_ = local_2f8._8_8_ & 0xffffffffffffff00;
  local_2f8._0_8_ = &PTR__lazy_ostream_013abbf0;
  local_2f8._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_2e0._M_local_buf[0] = (char)&local_428;
  local_2e0._1_7_ = (undefined7)((ulong)&local_428 >> 8);
  local_430 = "1";
  local_58._8_8_ = local_58._8_8_ & 0xffffffffffffff00;
  local_58._0_8_ = &PTR__lazy_ostream_013ac2b0;
  aStack_48._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  aStack_48._8_8_ = &local_430;
  pvVar8 = (iterator)0x1;
  pvVar9 = (iterator)0x2;
  local_428 = (UniValue *)local_318;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_410,&local_450,1,2,REQUIRE,0xe961f8,(size_t)&local_420,0x7e,
             local_2f8,"\"1\"",local_58);
  boost::detail::shared_count::~shared_count(&sStack_400);
  if ((undefined1 *)local_318._0_8_ != local_308) {
    operator_delete((void *)local_318._0_8_,(ulong)(local_308._0_8_ + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_358._M_dataplus._M_p != &local_358.field_2) {
    operator_delete(local_358._M_dataplus._M_p,local_358.field_2._M_allocated_capacity + 1);
  }
  if ((undefined1 *)local_338._0_8_ != local_338 + 0x10) {
    operator_delete((void *)local_338._0_8_,local_338._16_8_ + 1);
  }
  local_c48 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/getarg_tests.cpp"
  ;
  local_c40 = "";
  local_c58 = &boost::unit_test::basic_cstring<char_const>::null;
  local_c50 = &boost::unit_test::basic_cstring<char_const>::null;
  file_48.m_end = (iterator)0x7f;
  file_48.m_begin = (iterator)&local_c48;
  msg_48.m_end = pvVar9;
  msg_48.m_begin = pvVar8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_48,(size_t)&local_c58,
             msg_48);
  local_450.m_empty = false;
  local_450._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013abb30;
  local_440 = boost::unit_test::lazy_ostream::inst;
  local_438 = (char **)0xf6cf21;
  local_318._0_8_ = local_308;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_318,"foo","");
  local_428 = (UniValue *)ArgsManager::GetIntArg(&args,(string *)local_318,100);
  local_430 = (char *)CONCAT44(local_430._4_4_,1);
  local_338[0] = local_428 == (UniValue *)0x1;
  local_338._8_8_ = (pointer)0x0;
  local_338._16_8_ = 0;
  local_358._M_dataplus._M_p =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/getarg_tests.cpp"
  ;
  local_358._M_string_length = 0xe9616d;
  local_410 = &local_428;
  local_2f8._8_8_ = local_2f8._8_8_ & 0xffffffffffffff00;
  local_2f8._0_8_ = &PTR__lazy_ostream_013abed0;
  local_2f8._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_2e0._M_local_buf[0] = (char)(assertion_result *)&local_410;
  uVar4 = local_2e0._M_local_buf[0];
  local_2e0._1_7_ = (undefined7)((ulong)&local_410 >> 8);
  uVar5 = local_2e0._1_7_;
  local_420 = &local_430;
  local_58._8_8_ = local_58._8_8_ & 0xffffffffffffff00;
  local_58._0_8_ = &PTR__lazy_ostream_013abcf0;
  aStack_48._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  pvVar8 = (iterator)0x1;
  pvVar9 = (iterator)0x2;
  aStack_48._8_8_ = &local_420;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_338,&local_450,1,2,REQUIRE,0xe96216,(size_t)&local_358,0x7f,
             local_2f8,"1",local_58);
  boost::detail::shared_count::~shared_count((shared_count *)(local_338 + 0x10));
  if ((undefined1 *)local_318._0_8_ != local_308) {
    operator_delete((void *)local_318._0_8_,(ulong)(local_308._0_8_ + 1));
  }
  local_c68 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/getarg_tests.cpp"
  ;
  local_c60 = "";
  local_c78 = &boost::unit_test::basic_cstring<char_const>::null;
  local_c70 = &boost::unit_test::basic_cstring<char_const>::null;
  file_49.m_end = (iterator)0x80;
  file_49.m_begin = (iterator)&local_c68;
  msg_49.m_end = pvVar9;
  msg_49.m_begin = pvVar8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_49,(size_t)&local_c78,
             msg_49);
  local_450.m_empty = false;
  local_450._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013abb30;
  local_440 = boost::unit_test::lazy_ostream::inst;
  local_438 = (char **)0xf6cf21;
  local_318._0_8_ = local_308;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_318,"foo","");
  bVar6 = ArgsManager::GetBoolArg(&args,(string *)local_318,true);
  local_428 = (UniValue *)CONCAT71(local_428._1_7_,bVar6);
  local_430 = (char *)CONCAT71(local_430._1_7_,1);
  local_338[0] = bVar6;
  local_338._8_8_ = (pointer)0x0;
  local_338._16_8_ = 0;
  local_358._M_dataplus._M_p =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/getarg_tests.cpp"
  ;
  local_358._M_string_length = 0xe9616d;
  local_410 = &local_428;
  local_2f8._8_8_ = local_2f8._8_8_ & 0xffffffffffffff00;
  local_2f8._0_8_ = &PTR__lazy_ostream_013abe90;
  local_2f8._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_420 = &local_430;
  local_58._8_8_ = local_58._8_8_ & 0xffffffffffffff00;
  local_58._0_8_ = &PTR__lazy_ostream_013abe90;
  aStack_48._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  pvVar8 = (iterator)0x1;
  pvVar9 = (iterator)0x2;
  local_2e0._M_local_buf[0] = uVar4;
  local_2e0._1_7_ = uVar5;
  aStack_48._8_8_ = &local_420;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_338,&local_450,1,2,REQUIRE,0xe96231,(size_t)&local_358,0x80,
             local_2f8,"true",local_58);
  boost::detail::shared_count::~shared_count((shared_count *)(local_338 + 0x10));
  if ((undefined1 *)local_318._0_8_ != local_308) {
    operator_delete((void *)local_318._0_8_,(ulong)(local_308._0_8_ + 1));
  }
  local_c88 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/getarg_tests.cpp"
  ;
  local_c80 = "";
  local_c98 = &boost::unit_test::basic_cstring<char_const>::null;
  local_c90 = &boost::unit_test::basic_cstring<char_const>::null;
  file_50.m_end = (iterator)0x81;
  file_50.m_begin = (iterator)&local_c88;
  msg_50.m_end = pvVar9;
  msg_50.m_begin = pvVar8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_50,(size_t)&local_c98,
             msg_50);
  local_450.m_empty = false;
  local_450._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013abb30;
  local_440 = boost::unit_test::lazy_ostream::inst;
  local_438 = (char **)0xf6cf21;
  local_318._0_8_ = local_308;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_318,"foo","");
  bVar6 = ArgsManager::GetBoolArg(&args,(string *)local_318,false);
  local_428 = (UniValue *)CONCAT71(local_428._1_7_,bVar6);
  local_430 = (char *)CONCAT71(local_430._1_7_,1);
  local_338[0] = bVar6;
  local_338._8_8_ = (pointer)0x0;
  local_338._16_8_ = 0;
  local_358._M_dataplus._M_p =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/getarg_tests.cpp"
  ;
  local_358._M_string_length = 0xe9616d;
  local_410 = &local_428;
  local_2f8._8_8_ = local_2f8._8_8_ & 0xffffffffffffff00;
  local_2f8._0_8_ = &PTR__lazy_ostream_013abe90;
  local_2f8._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_420 = &local_430;
  local_58._8_8_ = local_58._8_8_ & 0xffffffffffffff00;
  local_58._0_8_ = &PTR__lazy_ostream_013abe90;
  aStack_48._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  pvVar8 = (iterator)0x1;
  pvVar9 = (iterator)0x2;
  local_2e0._M_local_buf[0] = uVar4;
  local_2e0._1_7_ = uVar5;
  aStack_48._8_8_ = &local_420;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_338,&local_450,1,2,REQUIRE,0xe9624e,(size_t)&local_358,0x81,
             local_2f8,"true",local_58);
  psVar2 = (shared_count *)(local_338 + 0x10);
  boost::detail::shared_count::~shared_count(psVar2);
  if ((undefined1 *)local_318._0_8_ != local_308) {
    operator_delete((void *)local_318._0_8_,(ulong)(local_308._0_8_ + 1));
  }
  local_58._0_8_ = local_58._0_8_ & 0xffffffffffffff00;
  ::UniValue::UniValue<bool,_bool,_true>((UniValue *)local_2f8,(bool *)local_58);
  test_method::anon_class_8_1_89897ddb::operator()(&set_foo,(SettingsValue *)local_2f8);
  std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&vStack_2b8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_2d0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2f8._8_8_ != &local_2e0) {
    operator_delete((void *)local_2f8._8_8_,CONCAT71(local_2e0._1_7_,local_2e0._M_local_buf[0]) + 1)
    ;
  }
  local_ca8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/getarg_tests.cpp"
  ;
  local_ca0 = "";
  local_cb8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_cb0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_51.m_end = (iterator)0x84;
  file_51.m_begin = (iterator)&local_ca8;
  msg_51.m_end = pvVar9;
  msg_51.m_begin = pvVar8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_51,(size_t)&local_cb8,
             msg_51);
  local_318[8] = false;
  local_318._0_8_ = &PTR__lazy_ostream_013abb30;
  local_308._0_8_ = boost::unit_test::lazy_ostream::inst;
  local_308._8_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  local_358._M_dataplus._M_p = (pointer)&local_358.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_358,"foo","");
  ArgsManager::GetSetting((SettingsValue *)local_2f8,&args,&local_358);
  ::UniValue::write_abi_cxx11_((UniValue *)local_338,(int)local_2f8,(void *)0x0,0);
  iVar7 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_338,
                     "false");
  local_410 = (UniValue **)CONCAT71(local_410._1_7_,iVar7 == 0);
  local_408 = (element_type *)0x0;
  sStack_400.pi_ = (sp_counted_base *)0x0;
  local_420 = (char **)0xe96108;
  local_418 = "";
  local_58._8_8_ = local_58._8_8_ & 0xffffffffffffff00;
  local_58._0_8_ = &PTR__lazy_ostream_013abbf0;
  aStack_48._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  aStack_48._8_8_ = &local_428;
  local_430 = "false";
  local_450.m_empty = false;
  local_450._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ac0b0;
  local_440 = boost::unit_test::lazy_ostream::inst;
  local_438 = &local_430;
  pvVar8 = (iterator)0x1;
  pvVar9 = (iterator)0x2;
  local_428 = (UniValue *)local_338;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_410,(lazy_ostream *)local_318,1,2,REQUIRE,0xe961c9,
             (size_t)&local_420,0x84,local_58,"\"false\"",&local_450);
  boost::detail::shared_count::~shared_count(&sStack_400);
  if ((shared_count *)local_338._0_8_ != psVar2) {
    operator_delete((void *)local_338._0_8_,local_338._16_8_ + 1);
  }
  std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&vStack_2b8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_2d0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2f8._8_8_ != &local_2e0) {
    operator_delete((void *)local_2f8._8_8_,CONCAT71(local_2e0._1_7_,local_2e0._M_local_buf[0]) + 1)
    ;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_358._M_dataplus._M_p != &local_358.field_2) {
    operator_delete(local_358._M_dataplus._M_p,local_358.field_2._M_allocated_capacity + 1);
  }
  local_cc8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/getarg_tests.cpp"
  ;
  local_cc0 = "";
  local_cd8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_cd0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_52.m_end = (iterator)0x85;
  file_52.m_begin = (iterator)&local_cc8;
  msg_52.m_end = pvVar9;
  msg_52.m_begin = pvVar8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_52,(size_t)&local_cd8,
             msg_52);
  local_450.m_empty = false;
  local_450._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013abb30;
  local_440 = boost::unit_test::lazy_ostream::inst;
  local_438 = (char **)0xf6cf21;
  local_338._0_8_ = psVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_338,"foo","");
  local_358._M_dataplus._M_p = (pointer)&local_358.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_358,"default","");
  ArgsManager::GetArg((string *)local_318,&args,(string *)local_338,&local_358);
  iVar7 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_318,
                     "0");
  local_410 = (UniValue **)CONCAT71(local_410._1_7_,iVar7 == 0);
  local_408 = (element_type *)0x0;
  sStack_400.pi_ = (sp_counted_base *)0x0;
  local_420 = (char **)0xe96108;
  local_418 = "";
  local_2f8._8_8_ = local_2f8._8_8_ & 0xffffffffffffff00;
  local_2f8._0_8_ = &PTR__lazy_ostream_013abbf0;
  local_2f8._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_2e0._M_local_buf[0] = (char)&local_428;
  local_2e0._1_7_ = (undefined7)((ulong)&local_428 >> 8);
  local_430 = "0";
  local_58._8_8_ = local_58._8_8_ & 0xffffffffffffff00;
  local_58._0_8_ = &PTR__lazy_ostream_013ac2b0;
  aStack_48._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  aStack_48._8_8_ = &local_430;
  pvVar8 = (iterator)0x1;
  pvVar9 = (iterator)0x2;
  local_428 = (UniValue *)local_318;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_410,&local_450,1,2,REQUIRE,0xe961f8,(size_t)&local_420,0x85,
             local_2f8,"\"0\"",local_58);
  boost::detail::shared_count::~shared_count(&sStack_400);
  if ((undefined1 *)local_318._0_8_ != local_308) {
    operator_delete((void *)local_318._0_8_,(ulong)(local_308._0_8_ + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_358._M_dataplus._M_p != &local_358.field_2) {
    operator_delete(local_358._M_dataplus._M_p,local_358.field_2._M_allocated_capacity + 1);
  }
  if ((shared_count *)local_338._0_8_ != psVar2) {
    operator_delete((void *)local_338._0_8_,local_338._16_8_ + 1);
  }
  local_ce8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/getarg_tests.cpp"
  ;
  local_ce0 = "";
  local_cf8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_cf0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_53.m_end = (iterator)0x86;
  file_53.m_begin = (iterator)&local_ce8;
  msg_53.m_end = pvVar9;
  msg_53.m_begin = pvVar8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_53,(size_t)&local_cf8,
             msg_53);
  local_450.m_empty = false;
  local_450._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013abb30;
  local_440 = boost::unit_test::lazy_ostream::inst;
  local_438 = (char **)0xf6cf21;
  local_318._0_8_ = local_308;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_318,"foo","");
  local_428 = (UniValue *)ArgsManager::GetIntArg(&args,(string *)local_318,100);
  local_430 = (char *)((ulong)local_430 & 0xffffffff00000000);
  local_338[0] = local_428 == (UniValue *)0x0;
  local_338._8_8_ = (pointer)0x0;
  local_338._16_8_ = 0;
  local_358._M_dataplus._M_p =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/getarg_tests.cpp"
  ;
  local_358._M_string_length = 0xe9616d;
  local_410 = &local_428;
  local_2f8._8_8_ = local_2f8._8_8_ & 0xffffffffffffff00;
  local_2f8._0_8_ = &PTR__lazy_ostream_013abed0;
  local_2f8._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_2e0._M_local_buf[0] = (char)(assertion_result *)&local_410;
  uVar4 = local_2e0._M_local_buf[0];
  local_2e0._1_7_ = (undefined7)((ulong)&local_410 >> 8);
  uVar5 = local_2e0._1_7_;
  local_420 = &local_430;
  local_58._8_8_ = local_58._8_8_ & 0xffffffffffffff00;
  local_58._0_8_ = &PTR__lazy_ostream_013abcf0;
  aStack_48._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  pvVar8 = (iterator)0x1;
  pvVar9 = (iterator)0x2;
  aStack_48._8_8_ = &local_420;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_338,&local_450,1,2,REQUIRE,0xe96216,(size_t)&local_358,0x86,
             local_2f8,"0",local_58);
  boost::detail::shared_count::~shared_count((shared_count *)(local_338 + 0x10));
  if ((undefined1 *)local_318._0_8_ != local_308) {
    operator_delete((void *)local_318._0_8_,(ulong)(local_308._0_8_ + 1));
  }
  local_d08 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/getarg_tests.cpp"
  ;
  local_d00 = "";
  local_d18 = &boost::unit_test::basic_cstring<char_const>::null;
  local_d10 = &boost::unit_test::basic_cstring<char_const>::null;
  file_54.m_end = (iterator)0x87;
  file_54.m_begin = (iterator)&local_d08;
  msg_54.m_end = pvVar9;
  msg_54.m_begin = pvVar8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_54,(size_t)&local_d18,
             msg_54);
  local_450.m_empty = false;
  local_450._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013abb30;
  local_440 = boost::unit_test::lazy_ostream::inst;
  local_438 = (char **)0xf6cf21;
  local_318._0_8_ = local_308;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_318,"foo","");
  bVar6 = ArgsManager::GetBoolArg(&args,(string *)local_318,true);
  local_428 = (UniValue *)CONCAT71(local_428._1_7_,bVar6);
  local_430 = (char *)((ulong)local_430 & 0xffffffffffffff00);
  local_338[0] = !bVar6;
  local_338._8_8_ = (pointer)0x0;
  local_338._16_8_ = 0;
  local_358._M_dataplus._M_p =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/getarg_tests.cpp"
  ;
  local_358._M_string_length = 0xe9616d;
  local_410 = &local_428;
  local_2f8._8_8_ = local_2f8._8_8_ & 0xffffffffffffff00;
  local_2f8._0_8_ = &PTR__lazy_ostream_013abe90;
  local_2f8._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_420 = &local_430;
  local_58._8_8_ = local_58._8_8_ & 0xffffffffffffff00;
  local_58._0_8_ = &PTR__lazy_ostream_013abe90;
  aStack_48._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  pvVar8 = (iterator)0x1;
  pvVar9 = (iterator)0x2;
  local_2e0._M_local_buf[0] = uVar4;
  local_2e0._1_7_ = uVar5;
  aStack_48._8_8_ = &local_420;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_338,&local_450,1,2,REQUIRE,0xe96231,(size_t)&local_358,0x87,
             local_2f8,"false",local_58);
  boost::detail::shared_count::~shared_count((shared_count *)(local_338 + 0x10));
  if ((undefined1 *)local_318._0_8_ != local_308) {
    operator_delete((void *)local_318._0_8_,(ulong)(local_308._0_8_ + 1));
  }
  local_d28 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/getarg_tests.cpp"
  ;
  local_d20 = "";
  local_d38 = &boost::unit_test::basic_cstring<char_const>::null;
  local_d30 = &boost::unit_test::basic_cstring<char_const>::null;
  file_55.m_end = (iterator)0x88;
  file_55.m_begin = (iterator)&local_d28;
  msg_55.m_end = pvVar9;
  msg_55.m_begin = pvVar8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_55,(size_t)&local_d38,
             msg_55);
  local_450.m_empty = false;
  local_450._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013abb30;
  local_440 = boost::unit_test::lazy_ostream::inst;
  local_438 = (char **)0xf6cf21;
  local_318._0_8_ = local_308;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_318,"foo","");
  bVar6 = ArgsManager::GetBoolArg(&args,(string *)local_318,false);
  local_428 = (UniValue *)CONCAT71(local_428._1_7_,bVar6);
  local_430 = (char *)((ulong)local_430 & 0xffffffffffffff00);
  local_338[0] = !bVar6;
  local_338._8_8_ = (pointer)0x0;
  local_338._16_8_ = 0;
  local_358._M_dataplus._M_p =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/getarg_tests.cpp"
  ;
  local_358._M_string_length = 0xe9616d;
  local_410 = &local_428;
  local_2f8._8_8_ = local_2f8._8_8_ & 0xffffffffffffff00;
  local_2f8._0_8_ = &PTR__lazy_ostream_013abe90;
  local_2f8._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_420 = &local_430;
  local_58._8_8_ = local_58._8_8_ & 0xffffffffffffff00;
  local_58._0_8_ = &PTR__lazy_ostream_013abe90;
  aStack_48._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  pvVar8 = (iterator)0x1;
  pvVar9 = (iterator)0x2;
  local_2e0._M_local_buf[0] = uVar4;
  local_2e0._1_7_ = uVar5;
  aStack_48._8_8_ = &local_420;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_338,&local_450,1,2,REQUIRE,0xe9624e,(size_t)&local_358,0x88,
             local_2f8,"false",local_58);
  boost::detail::shared_count::~shared_count((shared_count *)(local_338 + 0x10));
  if ((undefined1 *)local_318._0_8_ != local_308) {
    operator_delete((void *)local_318._0_8_,(ulong)(local_308._0_8_ + 1));
  }
  local_370 = 0;
  local_2f8._0_4_ = 1;
  local_2e0._M_local_buf[0] = '\0';
  local_2e0._1_7_ = uStack_367;
  local_2e0._9_3_ = (undefined3)local_35f;
  local_2e0._M_local_buf[8] = uStack_360;
  local_2e0._M_local_buf[0xc] = (char)((uint)local_35f >> 0x18);
  local_2e0._13_2_ = local_35b;
  local_2e0._M_local_buf[0xf] = local_359;
  local_2f8._16_8_ = 0;
  local_368 = 0;
  local_2d0.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_2d0.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_2d0.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  vStack_2b8.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)0x0;
  vStack_2b8.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)0x0;
  vStack_2b8.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)0x0;
  local_378 = &local_368;
  local_2f8._8_8_ = &local_2e0;
  test_method::anon_class_8_1_89897ddb::operator()(&set_foo,(SettingsValue *)local_2f8);
  std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&vStack_2b8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_2d0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2f8._8_8_ != &local_2e0) {
    operator_delete((void *)local_2f8._8_8_,CONCAT71(local_2e0._1_7_,local_2e0._M_local_buf[0]) + 1)
    ;
  }
  if (local_378 != &local_368) {
    operator_delete(local_378,CONCAT71(uStack_367,local_368) + 1);
  }
  local_d48 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/getarg_tests.cpp"
  ;
  local_d40 = "";
  local_d58 = &boost::unit_test::basic_cstring<char_const>::null;
  local_d50 = &boost::unit_test::basic_cstring<char_const>::null;
  file_56.m_end = (iterator)0x8b;
  file_56.m_begin = (iterator)&local_d48;
  msg_56.m_end = pvVar9;
  msg_56.m_begin = pvVar8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_56,(size_t)&local_d58,
             msg_56);
  local_318[8] = false;
  local_318._0_8_ = &PTR__lazy_ostream_013abb30;
  local_308._0_8_ = boost::unit_test::lazy_ostream::inst;
  local_308._8_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  local_358._M_dataplus._M_p = (pointer)&local_358.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_358,"foo","");
  ArgsManager::GetSetting((SettingsValue *)local_2f8,&args,&local_358);
  ::UniValue::write_abi_cxx11_((UniValue *)local_338,(int)local_2f8,(void *)0x0,0);
  pcVar1 = local_2f8 + 0x10;
  iVar7 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_338,
                     "{}");
  local_410 = (UniValue **)CONCAT71(local_410._1_7_,iVar7 == 0);
  local_408 = (element_type *)0x0;
  sStack_400.pi_ = (sp_counted_base *)0x0;
  local_420 = (char **)0xe96108;
  local_418 = "";
  local_58._8_8_ = local_58._8_8_ & 0xffffffffffffff00;
  local_58._0_8_ = &PTR__lazy_ostream_013abbf0;
  aStack_48._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  aStack_48._8_8_ = &local_428;
  local_430 = "{}";
  local_450.m_empty = false;
  local_450._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ad300;
  local_440 = boost::unit_test::lazy_ostream::inst;
  local_438 = &local_430;
  pvVar8 = (iterator)0x1;
  pvVar9 = (iterator)0x2;
  local_428 = (UniValue *)local_338;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_410,(lazy_ostream *)local_318,1,2,REQUIRE,0xe961c9,
             (size_t)&local_420,0x8b,local_58,"\"{}\"",&local_450);
  boost::detail::shared_count::~shared_count(&sStack_400);
  if ((undefined1 *)local_338._0_8_ != local_338 + 0x10) {
    operator_delete((void *)local_338._0_8_,local_338._16_8_ + 1);
  }
  std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&vStack_2b8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_2d0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2f8._8_8_ != &local_2e0) {
    operator_delete((void *)local_2f8._8_8_,CONCAT71(local_2e0._1_7_,local_2e0._M_local_buf[0]) + 1)
    ;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_358._M_dataplus._M_p != &local_358.field_2) {
    operator_delete(local_358._M_dataplus._M_p,local_358.field_2._M_allocated_capacity + 1);
  }
  local_d68 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/getarg_tests.cpp"
  ;
  local_d60 = "";
  local_d78 = &boost::unit_test::basic_cstring<char_const>::null;
  local_d70 = &boost::unit_test::basic_cstring<char_const>::null;
  file_57.m_end = (iterator)0x8c;
  file_57.m_begin = (iterator)&local_d68;
  msg_57.m_end = pvVar9;
  msg_57.m_begin = pvVar8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_57,(size_t)&local_d78,
             msg_57);
  local_2f8._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2f8,"foo","");
  local_58._0_8_ = &aStack_48;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_58,"default","");
  ArgsManager::GetArg(&local_398,&args,(string *)local_2f8,(string *)local_58);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_398._M_dataplus._M_p != &local_398.field_2) {
    operator_delete(local_398._M_dataplus._M_p,local_398.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._0_8_ != &aStack_48) {
    operator_delete((void *)local_58._0_8_,(ulong)(aStack_48._M_allocated_capacity + 1));
  }
  if ((pointer)local_2f8._0_8_ != pcVar1) {
    operator_delete((void *)local_2f8._0_8_,local_2f8._16_8_ + 1);
  }
  local_d88 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/getarg_tests.cpp"
  ;
  local_d80 = "";
  local_d98 = &boost::unit_test::basic_cstring<char_const>::null;
  local_d90 = &boost::unit_test::basic_cstring<char_const>::null;
  _cVar10 = 0x3e160e;
  file_58.m_end = (iterator)0x8c;
  file_58.m_begin = (iterator)&local_d88;
  msg_58.m_end = pvVar9;
  msg_58.m_begin = pvVar8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_58,(size_t)&local_d98,
             msg_58);
  local_58._0_8_ = local_58._0_8_ & 0xffffffffffffff00;
  local_58._8_8_ = (element_type *)0x0;
  aStack_48._M_allocated_capacity = 0;
  local_2f8._8_8_ = local_2f8._8_8_ & 0xffffffffffffff00;
  local_2f8._0_8_ = &PTR__lazy_ostream_013ac470;
  local_2f8._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_2e0._M_local_buf[0] = -0x3e;
  local_2e0._1_7_ = 0xe581;
  local_da8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/getarg_tests.cpp"
  ;
  local_da0 = "";
  pvVar8 = (iterator)0x1;
  pvVar9 = (iterator)0x1;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_58,(lazy_ostream *)local_2f8,1,1,WARN,_cVar10,
             (size_t)&local_da8,0x8c);
  boost::detail::shared_count::~shared_count((shared_count *)&aStack_48._M_allocated_capacity);
  local_de8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/getarg_tests.cpp"
  ;
  local_de0 = "";
  local_df8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_df0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_59.m_end = (iterator)0x8d;
  file_59.m_begin = (iterator)&local_de8;
  msg_59.m_end = pvVar9;
  msg_59.m_begin = pvVar8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_59,(size_t)&local_df8,
             msg_59);
  local_2f8._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2f8,"foo","");
  ArgsManager::GetIntArg(&args,(string *)local_2f8,100);
  if ((pointer)local_2f8._0_8_ != pcVar1) {
    operator_delete((void *)local_2f8._0_8_,(ulong)(local_2f8._16_8_ + 1));
  }
  local_e08 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/getarg_tests.cpp"
  ;
  local_e00 = "";
  local_e18 = &boost::unit_test::basic_cstring<char_const>::null;
  local_e10 = &boost::unit_test::basic_cstring<char_const>::null;
  _cVar10 = 0x3e174b;
  file_60.m_end = (iterator)0x8d;
  file_60.m_begin = (iterator)&local_e08;
  msg_60.m_end = pvVar9;
  msg_60.m_begin = pvVar8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_60,(size_t)&local_e18,
             msg_60);
  local_58._0_8_ = local_58._0_8_ & 0xffffffffffffff00;
  local_58._8_8_ = (element_type *)0x0;
  aStack_48._M_allocated_capacity = 0;
  local_2f8._8_8_ = local_2f8._8_8_ & 0xffffffffffffff00;
  local_2f8._0_8_ = &PTR__lazy_ostream_013ac470;
  local_2f8._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_2e0._M_local_buf[0] = -0x3e;
  local_2e0._1_7_ = 0xe581;
  local_e28 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/getarg_tests.cpp"
  ;
  local_e20 = "";
  pvVar8 = (iterator)0x1;
  pvVar9 = (iterator)0x1;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_58,(lazy_ostream *)local_2f8,1,1,WARN,_cVar10,
             (size_t)&local_e28,0x8d);
  boost::detail::shared_count::~shared_count((shared_count *)&aStack_48._M_allocated_capacity);
  local_e68 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/getarg_tests.cpp"
  ;
  local_e60 = "";
  local_e78 = &boost::unit_test::basic_cstring<char_const>::null;
  local_e70 = &boost::unit_test::basic_cstring<char_const>::null;
  file_61.m_end = (iterator)0x8e;
  file_61.m_begin = (iterator)&local_e68;
  msg_61.m_end = pvVar9;
  msg_61.m_begin = pvVar8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_61,(size_t)&local_e78,
             msg_61);
  local_2f8._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2f8,"foo","");
  ArgsManager::GetBoolArg(&args,(string *)local_2f8,true);
  if ((pointer)local_2f8._0_8_ != pcVar1) {
    operator_delete((void *)local_2f8._0_8_,(ulong)(local_2f8._16_8_ + 1));
  }
  local_e88 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/getarg_tests.cpp"
  ;
  local_e80 = "";
  local_e98 = &boost::unit_test::basic_cstring<char_const>::null;
  local_e90 = &boost::unit_test::basic_cstring<char_const>::null;
  _cVar10 = 0x3e1888;
  file_62.m_end = (iterator)0x8e;
  file_62.m_begin = (iterator)&local_e88;
  msg_62.m_end = pvVar9;
  msg_62.m_begin = pvVar8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_62,(size_t)&local_e98,
             msg_62);
  local_58._0_8_ = local_58._0_8_ & 0xffffffffffffff00;
  local_58._8_8_ = (element_type *)0x0;
  aStack_48._M_allocated_capacity = 0;
  local_2f8._8_8_ = local_2f8._8_8_ & 0xffffffffffffff00;
  local_2f8._0_8_ = &PTR__lazy_ostream_013ac470;
  local_2f8._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_2e0._M_local_buf[0] = -0x3e;
  local_2e0._1_7_ = 0xe581;
  local_ea8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/getarg_tests.cpp"
  ;
  local_ea0 = "";
  pvVar8 = (iterator)0x1;
  pvVar9 = (iterator)0x1;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_58,(lazy_ostream *)local_2f8,1,1,WARN,_cVar10,
             (size_t)&local_ea8,0x8e);
  boost::detail::shared_count::~shared_count((shared_count *)&aStack_48._M_allocated_capacity);
  local_ee8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/getarg_tests.cpp"
  ;
  local_ee0 = "";
  local_ef8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_ef0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_63.m_end = (iterator)0x8f;
  file_63.m_begin = (iterator)&local_ee8;
  msg_63.m_end = pvVar9;
  msg_63.m_begin = pvVar8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_63,(size_t)&local_ef8,
             msg_63);
  local_2f8._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2f8,"foo","");
  ArgsManager::GetBoolArg(&args,(string *)local_2f8,false);
  if ((pointer)local_2f8._0_8_ != pcVar1) {
    operator_delete((void *)local_2f8._0_8_,(ulong)(local_2f8._16_8_ + 1));
  }
  local_f08 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/getarg_tests.cpp"
  ;
  local_f00 = "";
  local_f18 = &boost::unit_test::basic_cstring<char_const>::null;
  local_f10 = &boost::unit_test::basic_cstring<char_const>::null;
  _cVar10 = 0x3e19c2;
  file_64.m_end = (iterator)0x8f;
  file_64.m_begin = (iterator)&local_f08;
  msg_64.m_end = pvVar9;
  msg_64.m_begin = pvVar8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_64,(size_t)&local_f18,
             msg_64);
  local_58._0_8_ = local_58._0_8_ & 0xffffffffffffff00;
  local_58._8_8_ = (element_type *)0x0;
  aStack_48._M_allocated_capacity = 0;
  local_2f8._8_8_ = local_2f8._8_8_ & 0xffffffffffffff00;
  local_2f8._0_8_ = &PTR__lazy_ostream_013ac470;
  local_2f8._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_2e0._M_local_buf[0] = -0x3e;
  local_2e0._1_7_ = 0xe581;
  local_f28 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/getarg_tests.cpp"
  ;
  local_f20 = "";
  pvVar8 = (iterator)0x1;
  pvVar9 = (iterator)0x1;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_58,(lazy_ostream *)local_2f8,1,1,WARN,_cVar10,
             (size_t)&local_f28,0x8f);
  boost::detail::shared_count::~shared_count((shared_count *)&aStack_48._M_allocated_capacity);
  local_3b0 = 0;
  local_2f8._0_4_ = 2;
  local_2e0._M_local_buf[0] = '\0';
  local_2e0._1_7_ = uStack_3a7;
  local_2e0._9_3_ = (undefined3)local_39f;
  local_2e0._M_local_buf[8] = uStack_3a0;
  local_2e0._M_local_buf[0xc] = (char)((uint)local_39f >> 0x18);
  local_2e0._13_2_ = local_39b;
  local_2e0._M_local_buf[0xf] = local_399;
  local_2f8._16_8_ = 0;
  local_3a8 = 0;
  local_2d0.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_2d0.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_2d0.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  vStack_2b8.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)0x0;
  vStack_2b8.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)0x0;
  vStack_2b8.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)0x0;
  local_3b8 = &local_3a8;
  local_2f8._8_8_ = &local_2e0;
  test_method::anon_class_8_1_89897ddb::operator()(&set_foo,(SettingsValue *)local_2f8);
  std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&vStack_2b8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_2d0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2f8._8_8_ != &local_2e0) {
    operator_delete((void *)local_2f8._8_8_,CONCAT71(local_2e0._1_7_,local_2e0._M_local_buf[0]) + 1)
    ;
  }
  if (local_3b8 != &local_3a8) {
    operator_delete(local_3b8,CONCAT71(uStack_3a7,local_3a8) + 1);
  }
  local_f68 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/getarg_tests.cpp"
  ;
  local_f60 = "";
  local_f78 = &boost::unit_test::basic_cstring<char_const>::null;
  local_f70 = &boost::unit_test::basic_cstring<char_const>::null;
  file_65.m_end = (iterator)0x92;
  file_65.m_begin = (iterator)&local_f68;
  msg_65.m_end = pvVar9;
  msg_65.m_begin = pvVar8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_65,(size_t)&local_f78,
             msg_65);
  local_318[8] = false;
  local_318._0_8_ = &PTR__lazy_ostream_013abb30;
  local_308._0_8_ = boost::unit_test::lazy_ostream::inst;
  local_308._8_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  local_358._M_dataplus._M_p = (pointer)&local_358.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_358,"foo","");
  ArgsManager::GetSetting((SettingsValue *)local_2f8,&args,&local_358);
  ::UniValue::write_abi_cxx11_((UniValue *)local_338,(int)local_2f8,(void *)0x0,0);
  pcVar1 = local_2f8 + 0x10;
  iVar7 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_338,
                     "[]");
  local_410 = (UniValue **)CONCAT71(local_410._1_7_,iVar7 == 0);
  local_408 = (element_type *)0x0;
  sStack_400.pi_ = (sp_counted_base *)0x0;
  local_420 = (char **)0xe96108;
  local_418 = "";
  local_58._8_8_ = local_58._8_8_ & 0xffffffffffffff00;
  local_58._0_8_ = &PTR__lazy_ostream_013abbf0;
  aStack_48._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  aStack_48._8_8_ = &local_428;
  local_430 = "[]";
  local_450.m_empty = false;
  local_450._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ad300;
  local_440 = boost::unit_test::lazy_ostream::inst;
  local_438 = &local_430;
  pvVar8 = (iterator)0x1;
  pvVar9 = (iterator)0x2;
  local_428 = (UniValue *)local_338;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_410,(lazy_ostream *)local_318,1,2,REQUIRE,0xe961c9,
             (size_t)&local_420,0x92,local_58,"\"[]\"",&local_450);
  boost::detail::shared_count::~shared_count(&sStack_400);
  if ((undefined1 *)local_338._0_8_ != local_338 + 0x10) {
    operator_delete((void *)local_338._0_8_,local_338._16_8_ + 1);
  }
  std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&vStack_2b8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_2d0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2f8._8_8_ != &local_2e0) {
    operator_delete((void *)local_2f8._8_8_,CONCAT71(local_2e0._1_7_,local_2e0._M_local_buf[0]) + 1)
    ;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_358._M_dataplus._M_p != &local_358.field_2) {
    operator_delete(local_358._M_dataplus._M_p,local_358.field_2._M_allocated_capacity + 1);
  }
  local_f88 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/getarg_tests.cpp"
  ;
  local_f80 = "";
  local_f98 = &boost::unit_test::basic_cstring<char_const>::null;
  local_f90 = &boost::unit_test::basic_cstring<char_const>::null;
  file_66.m_end = (iterator)0x93;
  file_66.m_begin = (iterator)&local_f88;
  msg_66.m_end = pvVar9;
  msg_66.m_begin = pvVar8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_66,(size_t)&local_f98,
             msg_66);
  local_2f8._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2f8,"foo","");
  local_58._0_8_ = &aStack_48;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_58,"default","");
  ArgsManager::GetArg(&local_3d8,&args,(string *)local_2f8,(string *)local_58);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3d8._M_dataplus._M_p != &local_3d8.field_2) {
    operator_delete(local_3d8._M_dataplus._M_p,local_3d8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._0_8_ != &aStack_48) {
    operator_delete((void *)local_58._0_8_,(ulong)(aStack_48._M_allocated_capacity + 1));
  }
  if ((pointer)local_2f8._0_8_ != pcVar1) {
    operator_delete((void *)local_2f8._0_8_,local_2f8._16_8_ + 1);
  }
  local_fa8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/getarg_tests.cpp"
  ;
  local_fa0 = "";
  local_fb8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_fb0 = &boost::unit_test::basic_cstring<char_const>::null;
  _cVar10 = 0x3e1eb2;
  file_67.m_end = (iterator)0x93;
  file_67.m_begin = (iterator)&local_fa8;
  msg_67.m_end = pvVar9;
  msg_67.m_begin = pvVar8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_67,(size_t)&local_fb8,
             msg_67);
  local_58._0_8_ = local_58._0_8_ & 0xffffffffffffff00;
  local_58._8_8_ = (element_type *)0x0;
  aStack_48._M_allocated_capacity = 0;
  local_2f8._8_8_ = local_2f8._8_8_ & 0xffffffffffffff00;
  local_2f8._0_8_ = &PTR__lazy_ostream_013ac470;
  local_2f8._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_2e0._M_local_buf[0] = -0x3e;
  local_2e0._1_7_ = 0xe581;
  local_fc8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/getarg_tests.cpp"
  ;
  local_fc0 = "";
  pvVar8 = (iterator)0x1;
  pvVar9 = (iterator)0x1;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_58,(lazy_ostream *)local_2f8,1,1,WARN,_cVar10,
             (size_t)&local_fc8,0x93);
  boost::detail::shared_count::~shared_count((shared_count *)&aStack_48._M_allocated_capacity);
  local_1008 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/getarg_tests.cpp"
  ;
  local_1000 = "";
  local_1018 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1010 = &boost::unit_test::basic_cstring<char_const>::null;
  file_68.m_end = (iterator)0x94;
  file_68.m_begin = (iterator)&local_1008;
  msg_68.m_end = pvVar9;
  msg_68.m_begin = pvVar8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_68,(size_t)&local_1018,
             msg_68);
  local_2f8._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2f8,"foo","");
  ArgsManager::GetIntArg(&args,(string *)local_2f8,100);
  if ((pointer)local_2f8._0_8_ != pcVar1) {
    operator_delete((void *)local_2f8._0_8_,(ulong)(local_2f8._16_8_ + 1));
  }
  local_1028 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/getarg_tests.cpp"
  ;
  local_1020 = "";
  local_1038 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1030 = &boost::unit_test::basic_cstring<char_const>::null;
  _cVar10 = 0x3e1fef;
  file_69.m_end = (iterator)0x94;
  file_69.m_begin = (iterator)&local_1028;
  msg_69.m_end = pvVar9;
  msg_69.m_begin = pvVar8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_69,(size_t)&local_1038,
             msg_69);
  local_58._0_8_ = local_58._0_8_ & 0xffffffffffffff00;
  local_58._8_8_ = (element_type *)0x0;
  aStack_48._M_allocated_capacity = 0;
  local_2f8._8_8_ = local_2f8._8_8_ & 0xffffffffffffff00;
  local_2f8._0_8_ = &PTR__lazy_ostream_013ac470;
  local_2f8._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_2e0._M_local_buf[0] = -0x3e;
  local_2e0._1_7_ = 0xe581;
  local_1048 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/getarg_tests.cpp"
  ;
  local_1040 = "";
  pvVar8 = (iterator)0x1;
  pvVar9 = (iterator)0x1;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_58,(lazy_ostream *)local_2f8,1,1,WARN,_cVar10,
             (size_t)&local_1048,0x94);
  boost::detail::shared_count::~shared_count((shared_count *)&aStack_48._M_allocated_capacity);
  local_1088 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/getarg_tests.cpp"
  ;
  local_1080 = "";
  local_1098 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1090 = &boost::unit_test::basic_cstring<char_const>::null;
  file_70.m_end = (iterator)0x95;
  file_70.m_begin = (iterator)&local_1088;
  msg_70.m_end = pvVar9;
  msg_70.m_begin = pvVar8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_70,(size_t)&local_1098,
             msg_70);
  local_2f8._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2f8,"foo","");
  ArgsManager::GetBoolArg(&args,(string *)local_2f8,true);
  if ((pointer)local_2f8._0_8_ != pcVar1) {
    operator_delete((void *)local_2f8._0_8_,(ulong)(local_2f8._16_8_ + 1));
  }
  local_10a8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/getarg_tests.cpp"
  ;
  local_10a0 = "";
  local_10b8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_10b0 = &boost::unit_test::basic_cstring<char_const>::null;
  _cVar10 = 0x3e212c;
  file_71.m_end = (iterator)0x95;
  file_71.m_begin = (iterator)&local_10a8;
  msg_71.m_end = pvVar9;
  msg_71.m_begin = pvVar8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_71,(size_t)&local_10b8,
             msg_71);
  local_58._0_8_ = local_58._0_8_ & 0xffffffffffffff00;
  local_58._8_8_ = (element_type *)0x0;
  aStack_48._M_allocated_capacity = 0;
  local_2f8._8_8_ = local_2f8._8_8_ & 0xffffffffffffff00;
  local_2f8._0_8_ = &PTR__lazy_ostream_013ac470;
  local_2f8._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_2e0._M_local_buf[0] = -0x3e;
  local_2e0._1_7_ = 0xe581;
  local_10c8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/getarg_tests.cpp"
  ;
  local_10c0 = "";
  pvVar8 = (iterator)0x1;
  pvVar9 = (iterator)0x1;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_58,(lazy_ostream *)local_2f8,1,1,WARN,_cVar10,
             (size_t)&local_10c8,0x95);
  boost::detail::shared_count::~shared_count((shared_count *)&aStack_48._M_allocated_capacity);
  local_1108 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/getarg_tests.cpp"
  ;
  local_1100 = "";
  local_1118 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1110 = &boost::unit_test::basic_cstring<char_const>::null;
  file_72.m_end = (iterator)0x96;
  file_72.m_begin = (iterator)&local_1108;
  msg_72.m_end = pvVar9;
  msg_72.m_begin = pvVar8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_72,(size_t)&local_1118,
             msg_72);
  local_2f8._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2f8,"foo","");
  ArgsManager::GetBoolArg(&args,(string *)local_2f8,false);
  if ((pointer)local_2f8._0_8_ != pcVar1) {
    operator_delete((void *)local_2f8._0_8_,(ulong)(local_2f8._16_8_ + 1));
  }
  local_1128 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/getarg_tests.cpp"
  ;
  local_1120 = "";
  local_1138 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1130 = &boost::unit_test::basic_cstring<char_const>::null;
  _cVar10 = 0x3e2266;
  file_73.m_end = (iterator)0x96;
  file_73.m_begin = (iterator)&local_1128;
  msg_73.m_end = pvVar9;
  msg_73.m_begin = pvVar8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_73,(size_t)&local_1138,
             msg_73);
  local_58._0_8_ = local_58._0_8_ & 0xffffffffffffff00;
  local_58._8_8_ = (element_type *)0x0;
  aStack_48._M_allocated_capacity = 0;
  local_2f8._8_8_ = local_2f8._8_8_ & 0xffffffffffffff00;
  local_2f8._0_8_ = &PTR__lazy_ostream_013ac470;
  local_2f8._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_2e0._M_local_buf[0] = -0x3e;
  local_2e0._1_7_ = 0xe581;
  local_1148 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/getarg_tests.cpp"
  ;
  local_1140 = "";
  pvVar8 = (iterator)0x1;
  pvVar9 = (iterator)0x1;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_58,(lazy_ostream *)local_2f8,1,1,WARN,_cVar10,
             (size_t)&local_1148,0x96);
  boost::detail::shared_count::~shared_count((shared_count *)&aStack_48._M_allocated_capacity);
  local_3f0 = 0;
  local_2f8._0_8_ = local_2f8._0_8_ & 0xffffffff00000000;
  local_2e0._M_local_buf[0] = '\0';
  local_2e0._1_7_ = uStack_3e7;
  local_2e0._9_3_ = (undefined3)local_3df;
  local_2e0._M_local_buf[8] = uStack_3e0;
  local_2e0._M_local_buf[0xc] = (char)((uint)local_3df >> 0x18);
  local_2e0._13_2_ = local_3db;
  local_2e0._M_local_buf[0xf] = local_3d9;
  local_2f8._16_8_ = 0;
  local_3e8 = 0;
  local_2d0.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_2d0.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_2d0.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  vStack_2b8.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)0x0;
  vStack_2b8.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)0x0;
  vStack_2b8.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)0x0;
  local_3f8 = &local_3e8;
  local_2f8._8_8_ = &local_2e0;
  test_method::anon_class_8_1_89897ddb::operator()(&set_foo,(SettingsValue *)local_2f8);
  std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&vStack_2b8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_2d0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2f8._8_8_ != &local_2e0) {
    operator_delete((void *)local_2f8._8_8_,CONCAT71(local_2e0._1_7_,local_2e0._M_local_buf[0]) + 1)
    ;
  }
  if (local_3f8 != &local_3e8) {
    operator_delete(local_3f8,CONCAT71(uStack_3e7,local_3e8) + 1);
  }
  local_1188 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/getarg_tests.cpp"
  ;
  local_1180 = "";
  local_1198 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1190 = &boost::unit_test::basic_cstring<char_const>::null;
  file_74.m_end = (iterator)0x99;
  file_74.m_begin = (iterator)&local_1188;
  msg_74.m_end = pvVar9;
  msg_74.m_begin = pvVar8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_74,(size_t)&local_1198,
             msg_74);
  local_318[8] = false;
  local_318._0_8_ = &PTR__lazy_ostream_013abb30;
  local_308._0_8_ = boost::unit_test::lazy_ostream::inst;
  local_308._8_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  local_358._M_dataplus._M_p = (pointer)&local_358.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_358,"foo","");
  ArgsManager::GetSetting((SettingsValue *)local_2f8,&args,&local_358);
  ::UniValue::write_abi_cxx11_((UniValue *)local_338,(int)local_2f8,(void *)0x0,0);
  iVar7 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_338,
                     "null");
  local_410 = (UniValue **)CONCAT71(local_410._1_7_,iVar7 == 0);
  local_408 = (element_type *)0x0;
  sStack_400.pi_ = (sp_counted_base *)0x0;
  local_420 = (char **)0xe96108;
  local_418 = "";
  local_58._8_8_ = local_58._8_8_ & 0xffffffffffffff00;
  local_58._0_8_ = &PTR__lazy_ostream_013abbf0;
  aStack_48._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  aStack_48._8_8_ = &local_428;
  local_430 = "null";
  local_450.m_empty = false;
  local_450._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ac430;
  local_440 = boost::unit_test::lazy_ostream::inst;
  local_438 = &local_430;
  pvVar8 = (iterator)0x1;
  pvVar9 = (iterator)0x2;
  local_428 = (UniValue *)local_338;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_410,(lazy_ostream *)local_318,1,2,REQUIRE,0xe961c9,
             (size_t)&local_420,0x99,local_58,"\"null\"",&local_450);
  boost::detail::shared_count::~shared_count(&sStack_400);
  if ((undefined1 *)local_338._0_8_ != local_338 + 0x10) {
    operator_delete((void *)local_338._0_8_,local_338._16_8_ + 1);
  }
  std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&vStack_2b8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_2d0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2f8._8_8_ != &local_2e0) {
    operator_delete((void *)local_2f8._8_8_,CONCAT71(local_2e0._1_7_,local_2e0._M_local_buf[0]) + 1)
    ;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_358._M_dataplus._M_p != &local_358.field_2) {
    operator_delete(local_358._M_dataplus._M_p,local_358.field_2._M_allocated_capacity + 1);
  }
  local_11a8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/getarg_tests.cpp"
  ;
  local_11a0 = "";
  local_11b8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_11b0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_75.m_end = (iterator)0x9a;
  file_75.m_begin = (iterator)&local_11a8;
  msg_75.m_end = pvVar9;
  msg_75.m_begin = pvVar8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_75,(size_t)&local_11b8,
             msg_75);
  local_450.m_empty = false;
  local_450._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013abb30;
  local_440 = boost::unit_test::lazy_ostream::inst;
  local_438 = (char **)0xf6cf21;
  local_338._0_8_ = local_338 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_338,"foo","");
  local_358._M_dataplus._M_p = (pointer)&local_358.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_358,"default","");
  ArgsManager::GetArg((string *)local_318,&args,(string *)local_338,&local_358);
  iVar7 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_318,
                     "default");
  local_410 = (UniValue **)CONCAT71(local_410._1_7_,iVar7 == 0);
  local_408 = (element_type *)0x0;
  sStack_400.pi_ = (sp_counted_base *)0x0;
  local_420 = (char **)0xe96108;
  local_418 = "";
  local_2f8._8_8_ = local_2f8._8_8_ & 0xffffffffffffff00;
  local_2f8._0_8_ = &PTR__lazy_ostream_013abbf0;
  local_2f8._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_2e0._M_local_buf[0] = (char)&local_428;
  local_2e0._1_7_ = (undefined7)((ulong)&local_428 >> 8);
  local_430 = "default";
  local_58._8_8_ = local_58._8_8_ & 0xffffffffffffff00;
  local_58._0_8_ = &PTR__lazy_ostream_013ac3b0;
  aStack_48._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  aStack_48._8_8_ = &local_430;
  pvVar8 = (iterator)0x1;
  pvVar9 = (iterator)0x2;
  local_428 = (UniValue *)local_318;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_410,&local_450,1,2,REQUIRE,0xe961f8,(size_t)&local_420,0x9a,
             local_2f8,"\"default\"",local_58);
  boost::detail::shared_count::~shared_count(&sStack_400);
  if ((undefined1 *)local_318._0_8_ != local_308) {
    operator_delete((void *)local_318._0_8_,(ulong)(local_308._0_8_ + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_358._M_dataplus._M_p != &local_358.field_2) {
    operator_delete(local_358._M_dataplus._M_p,local_358.field_2._M_allocated_capacity + 1);
  }
  if ((undefined1 *)local_338._0_8_ != local_338 + 0x10) {
    operator_delete((void *)local_338._0_8_,local_338._16_8_ + 1);
  }
  local_11c8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/getarg_tests.cpp"
  ;
  local_11c0 = "";
  local_11d8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_11d0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_76.m_end = (iterator)0x9b;
  file_76.m_begin = (iterator)&local_11c8;
  msg_76.m_end = pvVar9;
  msg_76.m_begin = pvVar8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_76,(size_t)&local_11d8,
             msg_76);
  local_450.m_empty = false;
  local_450._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013abb30;
  local_440 = boost::unit_test::lazy_ostream::inst;
  local_438 = (char **)0xf6cf21;
  local_318._0_8_ = local_308;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_318,"foo","");
  local_428 = (UniValue *)ArgsManager::GetIntArg(&args,(string *)local_318,100);
  local_430 = (char *)CONCAT44(local_430._4_4_,100);
  local_338[0] = local_428 == (UniValue *)0x64;
  local_338._8_8_ = (pointer)0x0;
  local_338._16_8_ = 0;
  local_358._M_dataplus._M_p =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/getarg_tests.cpp"
  ;
  local_358._M_string_length = 0xe9616d;
  local_410 = &local_428;
  local_2f8._8_8_ = local_2f8._8_8_ & 0xffffffffffffff00;
  local_2f8._0_8_ = &PTR__lazy_ostream_013abed0;
  local_2f8._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_2e0._M_local_buf[0] = (char)(assertion_result *)&local_410;
  uVar4 = local_2e0._M_local_buf[0];
  local_2e0._1_7_ = (undefined7)((ulong)&local_410 >> 8);
  uVar5 = local_2e0._1_7_;
  local_420 = &local_430;
  local_58._8_8_ = local_58._8_8_ & 0xffffffffffffff00;
  local_58._0_8_ = &PTR__lazy_ostream_013abcf0;
  aStack_48._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  pvVar8 = (iterator)0x1;
  pvVar9 = (iterator)0x2;
  aStack_48._8_8_ = &local_420;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_338,&local_450,1,2,REQUIRE,0xe96216,(size_t)&local_358,0x9b,
             local_2f8,"100",local_58);
  boost::detail::shared_count::~shared_count((shared_count *)(local_338 + 0x10));
  if ((undefined1 *)local_318._0_8_ != local_308) {
    operator_delete((void *)local_318._0_8_,(ulong)(local_308._0_8_ + 1));
  }
  local_11e8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/getarg_tests.cpp"
  ;
  local_11e0 = "";
  local_11f8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_11f0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_77.m_end = (iterator)0x9c;
  file_77.m_begin = (iterator)&local_11e8;
  msg_77.m_end = pvVar9;
  msg_77.m_begin = pvVar8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_77,(size_t)&local_11f8,
             msg_77);
  local_450.m_empty = false;
  local_450._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013abb30;
  local_440 = boost::unit_test::lazy_ostream::inst;
  local_438 = (char **)0xf6cf21;
  local_318._0_8_ = local_308;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_318,"foo","");
  bVar6 = ArgsManager::GetBoolArg(&args,(string *)local_318,true);
  local_428 = (UniValue *)CONCAT71(local_428._1_7_,bVar6);
  local_430 = (char *)CONCAT71(local_430._1_7_,1);
  local_338[0] = bVar6;
  local_338._8_8_ = (pointer)0x0;
  local_338._16_8_ = 0;
  local_358._M_dataplus._M_p =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/getarg_tests.cpp"
  ;
  local_358._M_string_length = 0xe9616d;
  local_410 = &local_428;
  local_2f8._8_8_ = local_2f8._8_8_ & 0xffffffffffffff00;
  local_2f8._0_8_ = &PTR__lazy_ostream_013abe90;
  local_2f8._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_420 = &local_430;
  local_58._8_8_ = local_58._8_8_ & 0xffffffffffffff00;
  local_58._0_8_ = &PTR__lazy_ostream_013abe90;
  aStack_48._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  pvVar8 = (iterator)0x1;
  pvVar9 = (iterator)0x2;
  local_2e0._M_local_buf[0] = uVar4;
  local_2e0._1_7_ = uVar5;
  aStack_48._8_8_ = &local_420;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_338,&local_450,1,2,REQUIRE,0xe96231,(size_t)&local_358,0x9c,
             local_2f8,"true",local_58);
  boost::detail::shared_count::~shared_count((shared_count *)(local_338 + 0x10));
  if ((undefined1 *)local_318._0_8_ != local_308) {
    operator_delete((void *)local_318._0_8_,(ulong)(local_308._0_8_ + 1));
  }
  local_1208 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/getarg_tests.cpp"
  ;
  local_1200 = "";
  local_1218 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1210 = &boost::unit_test::basic_cstring<char_const>::null;
  file_78.m_end = (iterator)0x9d;
  file_78.m_begin = (iterator)&local_1208;
  msg_78.m_end = pvVar9;
  msg_78.m_begin = pvVar8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_78,(size_t)&local_1218,
             msg_78);
  local_450.m_empty = false;
  local_450._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013abb30;
  local_440 = boost::unit_test::lazy_ostream::inst;
  local_438 = (char **)0xf6cf21;
  local_318._0_8_ = local_308;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_318,"foo","");
  bVar6 = ArgsManager::GetBoolArg(&args,(string *)local_318,false);
  local_428 = (UniValue *)CONCAT71(local_428._1_7_,bVar6);
  local_430 = (char *)((ulong)local_430 & 0xffffffffffffff00);
  local_338[0] = !bVar6;
  local_338._8_8_ = (pointer)0x0;
  local_338._16_8_ = 0;
  local_358._M_dataplus._M_p =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/getarg_tests.cpp"
  ;
  local_358._M_string_length = 0xe9616d;
  local_410 = &local_428;
  local_2f8._8_8_ = local_2f8._8_8_ & 0xffffffffffffff00;
  local_2f8._0_8_ = &PTR__lazy_ostream_013abe90;
  local_2f8._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_420 = &local_430;
  local_58._8_8_ = local_58._8_8_ & 0xffffffffffffff00;
  local_58._0_8_ = &PTR__lazy_ostream_013abe90;
  aStack_48._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_2e0._M_local_buf[0] = uVar4;
  local_2e0._1_7_ = uVar5;
  aStack_48._8_8_ = &local_420;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_338,&local_450,1,2,REQUIRE,0xe9624e,(size_t)&local_358,0x9d,
             local_2f8,"false",local_58);
  boost::detail::shared_count::~shared_count((shared_count *)(local_338 + 0x10));
  if ((undefined1 *)local_318._0_8_ != local_308) {
    operator_delete((void *)local_318._0_8_,(ulong)(local_308._0_8_ + 1));
  }
  ArgsManager::~ArgsManager(&args);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(setting_args)
{
    ArgsManager args;
    SetupArgs(args, {{"-foo", ArgsManager::ALLOW_ANY}});

    auto set_foo = [&](const common::SettingsValue& value) {
      args.LockSettings([&](common::Settings& settings) {
        settings.rw_settings["foo"] = value;
      });
    };

    set_foo("str");
    BOOST_CHECK_EQUAL(args.GetSetting("foo").write(), "\"str\"");
    BOOST_CHECK_EQUAL(args.GetArg("foo", "default"), "str");
    BOOST_CHECK_EQUAL(args.GetIntArg("foo", 100), 0);
    BOOST_CHECK_EQUAL(args.GetBoolArg("foo", true), false);
    BOOST_CHECK_EQUAL(args.GetBoolArg("foo", false), false);

    set_foo("99");
    BOOST_CHECK_EQUAL(args.GetSetting("foo").write(), "\"99\"");
    BOOST_CHECK_EQUAL(args.GetArg("foo", "default"), "99");
    BOOST_CHECK_EQUAL(args.GetIntArg("foo", 100), 99);
    BOOST_CHECK_EQUAL(args.GetBoolArg("foo", true), true);
    BOOST_CHECK_EQUAL(args.GetBoolArg("foo", false), true);

    set_foo("3.25");
    BOOST_CHECK_EQUAL(args.GetSetting("foo").write(), "\"3.25\"");
    BOOST_CHECK_EQUAL(args.GetArg("foo", "default"), "3.25");
    BOOST_CHECK_EQUAL(args.GetIntArg("foo", 100), 3);
    BOOST_CHECK_EQUAL(args.GetBoolArg("foo", true), true);
    BOOST_CHECK_EQUAL(args.GetBoolArg("foo", false), true);

    set_foo("0");
    BOOST_CHECK_EQUAL(args.GetSetting("foo").write(), "\"0\"");
    BOOST_CHECK_EQUAL(args.GetArg("foo", "default"), "0");
    BOOST_CHECK_EQUAL(args.GetIntArg("foo", 100), 0);
    BOOST_CHECK_EQUAL(args.GetBoolArg("foo", true), false);
    BOOST_CHECK_EQUAL(args.GetBoolArg("foo", false), false);

    set_foo("");
    BOOST_CHECK_EQUAL(args.GetSetting("foo").write(), "\"\"");
    BOOST_CHECK_EQUAL(args.GetArg("foo", "default"), "");
    BOOST_CHECK_EQUAL(args.GetIntArg("foo", 100), 0);
    BOOST_CHECK_EQUAL(args.GetBoolArg("foo", true), true);
    BOOST_CHECK_EQUAL(args.GetBoolArg("foo", false), true);

    set_foo(99);
    BOOST_CHECK_EQUAL(args.GetSetting("foo").write(), "99");
    BOOST_CHECK_EQUAL(args.GetArg("foo", "default"), "99");
    BOOST_CHECK_EQUAL(args.GetIntArg("foo", 100), 99);
    BOOST_CHECK_THROW(args.GetBoolArg("foo", true), std::runtime_error);
    BOOST_CHECK_THROW(args.GetBoolArg("foo", false), std::runtime_error);

    set_foo(3.25);
    BOOST_CHECK_EQUAL(args.GetSetting("foo").write(), "3.25");
    BOOST_CHECK_EQUAL(args.GetArg("foo", "default"), "3.25");
    BOOST_CHECK_THROW(args.GetIntArg("foo", 100), std::runtime_error);
    BOOST_CHECK_THROW(args.GetBoolArg("foo", true), std::runtime_error);
    BOOST_CHECK_THROW(args.GetBoolArg("foo", false), std::runtime_error);

    set_foo(0);
    BOOST_CHECK_EQUAL(args.GetSetting("foo").write(), "0");
    BOOST_CHECK_EQUAL(args.GetArg("foo", "default"), "0");
    BOOST_CHECK_EQUAL(args.GetIntArg("foo", 100), 0);
    BOOST_CHECK_THROW(args.GetBoolArg("foo", true), std::runtime_error);
    BOOST_CHECK_THROW(args.GetBoolArg("foo", false), std::runtime_error);

    set_foo(true);
    BOOST_CHECK_EQUAL(args.GetSetting("foo").write(), "true");
    BOOST_CHECK_EQUAL(args.GetArg("foo", "default"), "1");
    BOOST_CHECK_EQUAL(args.GetIntArg("foo", 100), 1);
    BOOST_CHECK_EQUAL(args.GetBoolArg("foo", true), true);
    BOOST_CHECK_EQUAL(args.GetBoolArg("foo", false), true);

    set_foo(false);
    BOOST_CHECK_EQUAL(args.GetSetting("foo").write(), "false");
    BOOST_CHECK_EQUAL(args.GetArg("foo", "default"), "0");
    BOOST_CHECK_EQUAL(args.GetIntArg("foo", 100), 0);
    BOOST_CHECK_EQUAL(args.GetBoolArg("foo", true), false);
    BOOST_CHECK_EQUAL(args.GetBoolArg("foo", false), false);

    set_foo(UniValue::VOBJ);
    BOOST_CHECK_EQUAL(args.GetSetting("foo").write(), "{}");
    BOOST_CHECK_THROW(args.GetArg("foo", "default"), std::runtime_error);
    BOOST_CHECK_THROW(args.GetIntArg("foo", 100), std::runtime_error);
    BOOST_CHECK_THROW(args.GetBoolArg("foo", true), std::runtime_error);
    BOOST_CHECK_THROW(args.GetBoolArg("foo", false), std::runtime_error);

    set_foo(UniValue::VARR);
    BOOST_CHECK_EQUAL(args.GetSetting("foo").write(), "[]");
    BOOST_CHECK_THROW(args.GetArg("foo", "default"), std::runtime_error);
    BOOST_CHECK_THROW(args.GetIntArg("foo", 100), std::runtime_error);
    BOOST_CHECK_THROW(args.GetBoolArg("foo", true), std::runtime_error);
    BOOST_CHECK_THROW(args.GetBoolArg("foo", false), std::runtime_error);

    set_foo(UniValue::VNULL);
    BOOST_CHECK_EQUAL(args.GetSetting("foo").write(), "null");
    BOOST_CHECK_EQUAL(args.GetArg("foo", "default"), "default");
    BOOST_CHECK_EQUAL(args.GetIntArg("foo", 100), 100);
    BOOST_CHECK_EQUAL(args.GetBoolArg("foo", true), true);
    BOOST_CHECK_EQUAL(args.GetBoolArg("foo", false), false);
}